

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx::forward
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  uint uVar19;
  _func_int *p_Var20;
  int *piVar21;
  long lVar22;
  void *pvVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined8 uVar37;
  int iVar38;
  float *pfVar39;
  uint uVar40;
  ulong uVar41;
  float *pfVar42;
  void *pvVar43;
  int iVar44;
  float *pfVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  uint uVar52;
  long lVar53;
  uint uVar54;
  long lVar55;
  long lVar56;
  uint uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar84 [28];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar136 [32];
  undefined1 auVar138 [64];
  float fVar146;
  float fVar174;
  float fVar175;
  v4sf one;
  undefined1 auVar160 [28];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar181;
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar195 [32];
  undefined1 auVar183 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar191 [16];
  undefined1 auVar205 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar225 [64];
  float fVar226;
  float fVar240;
  undefined1 auVar227 [16];
  undefined1 auVar232 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar244;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar238;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 in_ZMM7 [64];
  undefined1 auVar237 [64];
  float fVar245;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar251 [64];
  float fVar259;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar263 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  float fVar284;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar297 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffe7c;
  uint local_160;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  undefined1 local_f8 [16];
  size_t local_e8;
  int local_e0;
  Allocator *local_d8;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  int local_c0;
  size_t local_b8;
  _func_int *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar124 [32];
  undefined1 auVar130 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  undefined1 auVar167 [32];
  undefined1 auVar196 [32];
  undefined1 auVar202 [32];
  
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_avx[-3]) != 0)) {
    iVar38 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar38;
  }
  iVar38 = cpu_support_x86_f16c();
  if ((iVar38 != 0) && (opt->use_fp16_storage == true)) {
    iVar38 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar38;
  }
  local_d0 = bottom_blob->dims;
  if (local_d0 == 2) {
    local_cc = bottom_blob->w;
    if (local_cc ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]),
                  bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var20 = this->_vptr_InnerProduct_x86_avx[-3];
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 *(Mat **)(&this->field_0x178 + (long)p_Var20),
                 *(int *)(&this->field_0xe0 + (long)p_Var20),
                 (Mat *)(&this->field_0xe8 + (long)p_Var20),
                 (Option *)CONCAT44(in_stack_fffffffffffffe7c,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_cc = bottom_blob->w;
  }
  piVar21 = bottom_blob->refcount;
  local_f8._0_8_ = bottom_blob->data;
  local_f8._8_8_ = bottom_blob->refcount;
  local_e8 = bottom_blob->elemsize;
  local_e0 = bottom_blob->elempack;
  local_d8 = bottom_blob->allocator;
  local_c8._0_4_ = bottom_blob->h;
  local_c8._4_4_ = bottom_blob->d;
  local_c0 = bottom_blob->c;
  local_b8 = bottom_blob->cstep;
  iVar38 = local_d0;
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + 1;
    UNLOCK();
    iVar38 = bottom_blob->dims;
  }
  if (iVar38 != 1) {
    auVar85[0] = opt->lightmode;
    auVar85._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar85._4_4_ = opt->num_threads;
    auVar85._8_8_ = opt->blob_allocator;
    uVar13 = opt->workspace_allocator;
    uVar14 = opt->openmp_blocktime;
    uVar15 = opt->use_winograd_convolution;
    uVar16 = opt->use_sgemm_convolution;
    uVar17 = opt->use_int8_inference;
    uVar18 = opt->use_vulkan_compute;
    auVar85[0x1f] = uVar18;
    auVar85[0x1e] = uVar17;
    auVar85[0x1d] = uVar16;
    auVar85[0x1c] = uVar15;
    auVar85._24_4_ = uVar14;
    auVar85._16_8_ = uVar13;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_1_ = opt->use_shader_pack8;
    uStack_50._1_1_ = opt->use_subgroup_basic;
    uStack_50._2_1_ = opt->use_subgroup_vote;
    uStack_50._3_1_ = opt->use_subgroup_ballot;
    uStack_50._4_1_ = opt->use_subgroup_shuffle;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_0;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_reserved_7;
    uStack_40._4_1_ = opt->use_reserved_8;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar85._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar85._16_16_;
    in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_f8);
  }
  uVar19 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]);
  uVar40 = 1;
  if (opt->use_packing_layout == true) {
    uVar40 = 8;
    if ((uVar19 & 7) != 0) {
      uVar40 = (uint)((uVar19 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar19 / (int)uVar40,(ulong)uVar40 * (local_e8 / (ulong)(long)local_e0),
              uVar40,opt->blob_allocator);
  auVar183 = in_ZMM12._0_16_;
  iVar38 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002e6cef;
  p_Var20 = this->_vptr_InnerProduct_x86_avx[-3];
  uVar19 = *(uint *)(&this->field_0xe0 + (long)p_Var20);
  lVar22 = *(long *)(&this->field_0x178 + (long)p_Var20);
  uVar57 = local_e0 * local_cc;
  iVar44 = top_blob->elempack;
  uVar40 = top_blob->w;
  uVar37 = local_f8._0_8_;
  if (iVar44 != 1) {
    if (iVar44 == 4) {
      iVar38 = 0;
      if ((int)uVar40 < 1) goto LAB_002e6cef;
      uVar41 = 0;
      auVar94 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar278 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar225 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        fVar284 = 0.0;
        fVar287 = 0.0;
        fVar288 = 0.0;
        fVar289 = 0.0;
        if (lVar22 != 0) {
          pfVar45 = (float *)(lVar22 + uVar41 * 0x10);
          fVar284 = *pfVar45;
          fVar287 = pfVar45[1];
          fVar288 = pfVar45[2];
          fVar289 = pfVar45[3];
        }
        pfVar45 = (float *)((long)(this->weight_data_tm).w * uVar41 *
                            (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pfVar39 = (float *)local_f8._0_8_;
        if ((int)uVar57 < 8) {
          fVar298 = 0.0;
          fVar299 = 0.0;
          fVar300 = 0.0;
          fVar301 = 0.0;
          fVar302 = 0.0;
          fVar303 = 0.0;
          fVar304 = 0.0;
          fVar239 = 0.0;
          fVar240 = 0.0;
          fVar241 = 0.0;
          fVar242 = 0.0;
          fVar243 = 0.0;
          fVar244 = 0.0;
          fVar294 = 0.0;
          fVar141 = 0.0;
          fVar142 = 0.0;
          fVar143 = 0.0;
          fVar144 = 0.0;
          fVar145 = 0.0;
          fVar226 = 0.0;
          fVar238 = 0.0;
          fVar290 = 0.0;
          fVar291 = 0.0;
          fVar292 = 0.0;
          fVar293 = 0.0;
          fVar95 = 0.0;
          fVar139 = 0.0;
          fVar140 = 0.0;
          uVar54 = 0;
        }
        else {
          fVar290 = 0.0;
          fVar291 = 0.0;
          fVar292 = 0.0;
          fVar293 = 0.0;
          fVar95 = 0.0;
          fVar139 = 0.0;
          fVar140 = 0.0;
          iVar38 = 7;
          fVar141 = 0.0;
          fVar142 = 0.0;
          fVar143 = 0.0;
          fVar144 = 0.0;
          fVar145 = 0.0;
          fVar226 = 0.0;
          fVar238 = 0.0;
          fVar239 = 0.0;
          fVar240 = 0.0;
          fVar241 = 0.0;
          fVar242 = 0.0;
          fVar243 = 0.0;
          fVar244 = 0.0;
          fVar294 = 0.0;
          fVar298 = 0.0;
          fVar299 = 0.0;
          fVar300 = 0.0;
          fVar301 = 0.0;
          fVar302 = 0.0;
          fVar303 = 0.0;
          fVar304 = 0.0;
          do {
            fVar146 = *pfVar39;
            fVar174 = pfVar39[1];
            fVar175 = pfVar39[2];
            fVar176 = pfVar39[3];
            fVar177 = pfVar39[4];
            fVar178 = pfVar39[6];
            fVar290 = fVar146 * *pfVar45 + fVar290;
            fVar291 = fVar146 * pfVar45[1] + fVar291;
            fVar292 = fVar146 * pfVar45[2] + fVar292;
            fVar293 = fVar146 * pfVar45[3] + fVar293;
            fVar95 = fVar174 * pfVar45[4] + fVar95;
            fVar139 = fVar174 * pfVar45[6] + fVar139;
            fVar140 = fVar174 + fVar140;
            fVar141 = fVar141 + fVar175 * pfVar45[8];
            fVar142 = fVar142 + fVar175 * pfVar45[9];
            fVar143 = fVar143 + fVar175 * pfVar45[10];
            fVar144 = fVar144 + fVar175 * pfVar45[0xb];
            fVar145 = fVar145 + fVar176 * pfVar45[0xc];
            fVar226 = fVar226 + fVar176 * pfVar45[0xe];
            fVar238 = fVar238 + fVar176;
            fVar239 = fVar177 * pfVar45[0x10] + fVar239;
            fVar240 = fVar177 * pfVar45[0x11] + fVar240;
            fVar241 = fVar177 * pfVar45[0x12] + fVar241;
            fVar242 = fVar177 * pfVar45[0x13] + fVar242;
            fVar243 = pfVar39[5] * pfVar45[0x14] + fVar243;
            fVar244 = pfVar39[5] * pfVar45[0x16] + fVar244;
            fVar294 = fVar174 + fVar294;
            fVar298 = fVar298 + fVar178 * pfVar45[0x18];
            fVar299 = fVar299 + fVar178 * pfVar45[0x19];
            fVar300 = fVar300 + fVar178 * pfVar45[0x1a];
            fVar301 = fVar301 + fVar178 * pfVar45[0x1b];
            fVar302 = fVar302 + pfVar39[7] * pfVar45[0x1c];
            fVar303 = fVar303 + pfVar39[7] * pfVar45[0x1e];
            fVar304 = fVar304 + fVar174;
            pfVar39 = pfVar39 + 8;
            pfVar45 = pfVar45 + 0x20;
            iVar38 = iVar38 + 8;
            uVar54 = uVar57 & 0xfffffff8;
          } while (iVar38 < (int)uVar57);
        }
        uVar52 = uVar54 | 3;
        while ((int)uVar52 < (int)uVar57) {
          fVar146 = *pfVar39;
          fVar174 = pfVar39[1];
          fVar175 = pfVar39[2];
          fVar176 = pfVar39[3];
          fVar290 = fVar146 * *pfVar45 + fVar290;
          fVar291 = fVar146 * pfVar45[1] + fVar291;
          fVar292 = fVar146 * pfVar45[2] + fVar292;
          fVar293 = fVar146 * pfVar45[3] + fVar293;
          fVar95 = fVar174 * pfVar45[4] + fVar95;
          fVar139 = fVar174 * pfVar45[6] + fVar139;
          fVar140 = fVar174 + fVar140;
          fVar141 = fVar141 + fVar175 * pfVar45[8];
          fVar142 = fVar142 + fVar175 * pfVar45[9];
          fVar143 = fVar143 + fVar175 * pfVar45[10];
          fVar144 = fVar144 + fVar175 * pfVar45[0xb];
          fVar145 = fVar145 + fVar176 * pfVar45[0xc];
          fVar226 = fVar226 + fVar176 * pfVar45[0xe];
          fVar238 = fVar238 + fVar176;
          pfVar39 = pfVar39 + 4;
          pfVar45 = pfVar45 + 0x10;
          uVar52 = uVar54 + 7;
          uVar54 = uVar54 + 4;
        }
        if (uVar57 - uVar54 != 0 && (int)uVar54 <= (int)uVar57) {
          lVar50 = 0;
          do {
            fVar146 = pfVar39[lVar50];
            fVar284 = fVar146 * *pfVar45 + fVar284;
            fVar287 = fVar146 * pfVar45[1] + fVar287;
            fVar288 = fVar146 * pfVar45[2] + fVar288;
            fVar289 = fVar146 * pfVar45[3] + fVar289;
            pfVar45 = pfVar45 + 4;
            lVar50 = lVar50 + 1;
          } while (uVar57 - uVar54 != (int)lVar50);
        }
        fVar291 = fVar299 + fVar240 + fVar142 + fVar291;
        auVar227._0_4_ =
             fVar302 + fVar243 + fVar145 + fVar95 + fVar298 + fVar239 + fVar141 + fVar290 + fVar284;
        auVar227._4_4_ = fVar291 + fVar291 + fVar287;
        auVar227._8_4_ =
             fVar303 + fVar244 + fVar226 + fVar139 + fVar300 + fVar241 + fVar143 + fVar292 + fVar288
        ;
        auVar227._12_4_ =
             fVar304 + fVar294 + fVar238 + fVar140 + fVar301 + fVar242 + fVar144 + fVar293 + fVar289
        ;
        auVar183 = auVar94._0_16_;
        fVar290 = auVar278._0_4_;
        fVar291 = auVar278._4_4_;
        fVar292 = auVar278._8_4_;
        fVar293 = auVar278._12_4_;
        auVar99 = auVar225._0_16_;
        fVar284 = auVar225._0_4_;
        fVar287 = auVar225._4_4_;
        fVar288 = auVar225._8_4_;
        fVar289 = auVar225._12_4_;
        switch(uVar19) {
        case 1:
          auVar227 = vmaxps_avx(auVar227,auVar183);
          break;
        case 2:
          auVar99 = vmaxps_avx(auVar227,auVar183);
          auVar183 = vminps_avx(auVar227,auVar183);
          fVar284 = **(float **)(&this->field_0xe8 + (long)p_Var20);
          auVar227._0_4_ = fVar284 * auVar183._0_4_ + auVar99._0_4_;
          auVar227._4_4_ = fVar284 * auVar183._4_4_ + auVar99._4_4_;
          auVar227._8_4_ = fVar284 * auVar183._8_4_ + auVar99._8_4_;
          auVar227._12_4_ = fVar284 * auVar183._12_4_ + auVar99._12_4_;
          break;
        case 3:
          uVar12 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var20);
          auVar100._4_4_ = uVar12;
          auVar100._0_4_ = uVar12;
          auVar100._8_4_ = uVar12;
          auVar100._12_4_ = uVar12;
          uVar12 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var20))[1];
          auVar155._4_4_ = uVar12;
          auVar155._0_4_ = uVar12;
          auVar155._8_4_ = uVar12;
          auVar155._12_4_ = uVar12;
          auVar183 = vmaxps_avx(auVar227,auVar100);
          auVar227 = vminps_avx(auVar183,auVar155);
          break;
        case 4:
          uVar47 = CONCAT44(auVar227._4_4_,auVar227._0_4_);
          auVar67._0_8_ = uVar47 ^ 0x8000000080000000;
          auVar67._8_4_ = -auVar227._8_4_;
          auVar67._12_4_ = -auVar227._12_4_;
          auVar101._8_4_ = 0x42b0c0a5;
          auVar101._0_8_ = 0x42b0c0a542b0c0a5;
          auVar101._12_4_ = 0x42b0c0a5;
          auVar183 = vminps_avx(auVar67,auVar101);
          auVar102._8_4_ = 0xc2b0c0a5;
          auVar102._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar102._12_4_ = 0xc2b0c0a5;
          auVar187 = vmaxps_avx(auVar183,auVar102);
          auVar103._0_4_ = fVar290 + auVar187._0_4_ * 1.442695;
          auVar103._4_4_ = fVar291 + auVar187._4_4_ * 1.442695;
          auVar103._8_4_ = fVar292 + auVar187._8_4_ * 1.442695;
          auVar103._12_4_ = fVar293 + auVar187._12_4_ * 1.442695;
          auVar156._0_4_ = (int)auVar103._0_4_;
          auVar156._4_4_ = (int)auVar103._4_4_;
          auVar156._8_4_ = (int)auVar103._8_4_;
          auVar156._12_4_ = (int)auVar103._12_4_;
          auVar227 = vcvtdq2ps_avx(auVar156);
          auVar183 = vcmpps_avx(auVar103,auVar227,1);
          auVar183 = vandps_avx(auVar183,auVar99);
          auVar183 = vsubps_avx(auVar227,auVar183);
          fVar95 = auVar187._0_4_ + auVar183._0_4_ * -0.6931472;
          fVar139 = auVar187._4_4_ + auVar183._4_4_ * -0.6931472;
          fVar140 = auVar187._8_4_ + auVar183._8_4_ * -0.6931472;
          fVar141 = auVar187._12_4_ + auVar183._12_4_ * -0.6931472;
          auVar104._0_4_ = (int)auVar183._0_4_;
          auVar104._4_4_ = (int)auVar183._4_4_;
          auVar104._8_4_ = (int)auVar183._8_4_;
          auVar104._12_4_ = (int)auVar183._12_4_;
          auVar183 = vpslld_avx(auVar104,0x17);
          auVar183 = vpaddd_avx(auVar183,auVar99);
          auVar68._0_4_ =
               (fVar95 + fVar284 +
               fVar95 * fVar95 *
               (fVar290 +
               ((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                0.041665796) * fVar95 + 0.16666666) * fVar95)) * auVar183._0_4_ + fVar284;
          auVar68._4_4_ =
               (fVar139 + fVar287 +
               fVar139 * fVar139 *
               (fVar291 +
               ((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                0.041665796) * fVar139 + 0.16666666) * fVar139)) * auVar183._4_4_ + fVar287;
          auVar68._8_4_ =
               (fVar140 + fVar288 +
               fVar140 * fVar140 *
               (fVar292 +
               ((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                0.041665796) * fVar140 + 0.16666666) * fVar140)) * auVar183._8_4_ + fVar288;
          auVar68._12_4_ =
               (fVar141 + fVar289 +
               fVar141 * fVar141 *
               (fVar293 +
               ((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                0.041665796) * fVar141 + 0.16666666) * fVar141)) * auVar183._12_4_ + fVar289;
          auVar183 = vrcpps_avx(auVar68);
          fVar284 = auVar183._0_4_;
          auVar69._0_4_ = auVar68._0_4_ * fVar284;
          fVar287 = auVar183._4_4_;
          auVar69._4_4_ = auVar68._4_4_ * fVar287;
          fVar288 = auVar183._8_4_;
          auVar69._8_4_ = auVar68._8_4_ * fVar288;
          fVar289 = auVar183._12_4_;
          auVar69._12_4_ = auVar68._12_4_ * fVar289;
          auVar183 = vsubps_avx(auVar99,auVar69);
          auVar227._0_4_ = fVar284 + fVar284 * auVar183._0_4_;
          auVar227._4_4_ = fVar287 + fVar287 * auVar183._4_4_;
          auVar227._8_4_ = fVar288 + fVar288 * auVar183._8_4_;
          auVar227._12_4_ = fVar289 + fVar289 * auVar183._12_4_;
          break;
        case 5:
          auVar260._8_4_ = 0x42b0c0a5;
          auVar260._0_8_ = 0x42b0c0a542b0c0a5;
          auVar260._12_4_ = 0x42b0c0a5;
          auVar183 = vminps_avx(auVar260,auVar227);
          auVar271._8_4_ = 0xc2b0c0a5;
          auVar271._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar271._12_4_ = 0xc2b0c0a5;
          auVar97 = vmaxps_avx(auVar271,auVar183);
          auVar148._0_4_ = fVar290 + auVar97._0_4_ * 1.442695;
          auVar148._4_4_ = fVar291 + auVar97._4_4_ * 1.442695;
          auVar148._8_4_ = fVar292 + auVar97._8_4_ * 1.442695;
          auVar148._12_4_ = fVar293 + auVar97._12_4_ * 1.442695;
          auVar185._0_4_ = (int)auVar148._0_4_;
          auVar185._4_4_ = (int)auVar148._4_4_;
          auVar185._8_4_ = (int)auVar148._8_4_;
          auVar185._12_4_ = (int)auVar148._12_4_;
          auVar187 = vcvtdq2ps_avx(auVar185);
          auVar183 = vcmpps_avx(auVar148,auVar187,1);
          auVar183 = vandps_avx(auVar183,auVar99);
          auVar183 = vsubps_avx(auVar187,auVar183);
          auVar186._0_4_ = auVar183._0_4_ * 0.6931472;
          auVar186._4_4_ = auVar183._4_4_ * 0.6931472;
          auVar186._8_4_ = auVar183._8_4_ * 0.6931472;
          auVar186._12_4_ = auVar183._12_4_ * 0.6931472;
          auVar187 = vsubps_avx(auVar97,auVar186);
          fVar95 = auVar187._0_4_;
          fVar139 = auVar187._4_4_;
          fVar140 = auVar187._8_4_;
          fVar141 = auVar187._12_4_;
          auVar149._0_4_ = (int)auVar183._0_4_;
          auVar149._4_4_ = (int)auVar183._4_4_;
          auVar149._8_4_ = (int)auVar183._8_4_;
          auVar149._12_4_ = (int)auVar183._12_4_;
          auVar183 = vpslld_avx(auVar149,0x17);
          auVar183 = vpaddd_avx(auVar183,auVar99);
          auVar96._0_4_ =
               (fVar95 + fVar284 +
               fVar95 * fVar95 *
               (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                 0.041665796) * fVar95 + 0.16666666) * fVar95 + fVar290)) * auVar183._0_4_ + fVar284
          ;
          auVar96._4_4_ =
               (fVar139 + fVar287 +
               fVar139 * fVar139 *
               (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                 0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar291)) * auVar183._4_4_ +
               fVar287;
          auVar96._8_4_ =
               (fVar140 + fVar288 +
               fVar140 * fVar140 *
               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar292)) * auVar183._8_4_ +
               fVar288;
          auVar96._12_4_ =
               (fVar141 + fVar289 +
               fVar141 * fVar141 *
               (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                 0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar293)) * auVar183._12_4_ +
               fVar289;
          auVar150._8_4_ = 0x800000;
          auVar150._0_8_ = 0x80000000800000;
          auVar150._12_4_ = 0x800000;
          auVar183 = vmaxps_avx(auVar96,auVar150);
          auVar187 = vpsrld_avx(auVar183,0x17);
          auVar228._8_4_ = 0xffffff82;
          auVar228._0_8_ = 0xffffff82ffffff82;
          auVar228._12_4_ = 0xffffff82;
          auVar187 = vpaddd_avx(auVar187,auVar228);
          auVar229._8_4_ = 0x807fffff;
          auVar229._0_8_ = 0x807fffff807fffff;
          auVar229._12_4_ = 0x807fffff;
          auVar183 = vandps_avx(auVar183,auVar229);
          auVar98 = vorps_avx(auVar183,auVar278._0_16_);
          auVar97 = vcvtdq2ps_avx(auVar187);
          auVar230._8_4_ = 0x3f3504f3;
          auVar230._0_8_ = 0x3f3504f33f3504f3;
          auVar230._12_4_ = 0x3f3504f3;
          auVar187 = vcmpps_avx(auVar98,auVar230,1);
          auVar183 = vandps_avx(auVar187,auVar98);
          fVar95 = auVar183._0_4_ + auVar98._0_4_ + -1.0;
          fVar139 = auVar183._4_4_ + auVar98._4_4_ + -1.0;
          fVar140 = auVar183._8_4_ + auVar98._8_4_ + -1.0;
          fVar141 = auVar183._12_4_ + auVar98._12_4_ + -1.0;
          auVar183 = vandps_avx(auVar187,auVar99);
          auVar187 = vsubps_avx(auVar97,auVar183);
          auVar183 = vcmpps_avx(auVar96,_DAT_00553040,2);
          auVar278 = ZEXT1664(auVar278._0_16_);
          auVar151._0_4_ =
               (auVar187._0_4_ * 0.6931472 + fVar95 +
               (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 + 0.116769984) * fVar95 +
                     -0.12420141) * fVar95 + 0.14249323) * fVar95 + -0.16668057) * fVar95 +
                  0.20000714) * fVar95 + -0.24999994) * fVar95 + 0.3333333) * fVar95 + -0.5) *
               fVar95 * fVar95) * -2.0;
          auVar151._4_4_ =
               (auVar187._4_4_ * 0.6931472 + fVar139 +
               (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) * fVar139 +
                     -0.12420141) * fVar139 + 0.14249323) * fVar139 + -0.16668057) * fVar139 +
                  0.20000714) * fVar139 + -0.24999994) * fVar139 + 0.3333333) * fVar139 + -0.5) *
               fVar139 * fVar139) * -2.0;
          auVar151._8_4_ =
               (auVar187._8_4_ * 0.6931472 + fVar140 +
               (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 + 0.116769984) * fVar140 +
                     -0.12420141) * fVar140 + 0.14249323) * fVar140 + -0.16668057) * fVar140 +
                  0.20000714) * fVar140 + -0.24999994) * fVar140 + 0.3333333) * fVar140 + -0.5) *
               fVar140 * fVar140) * -2.0;
          auVar151._12_4_ =
               (auVar187._12_4_ * 0.6931472 + fVar141 +
               (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) * fVar141 +
                     -0.12420141) * fVar141 + 0.14249323) * fVar141 + -0.16668057) * fVar141 +
                  0.20000714) * fVar141 + -0.24999994) * fVar141 + 0.3333333) * fVar141 + -0.5) *
               fVar141 * fVar141) * -2.0;
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar183 = vblendvps_avx(auVar151,auVar188,auVar183);
          auVar152._8_4_ = 0x42b0c0a5;
          auVar152._0_8_ = 0x42b0c0a542b0c0a5;
          auVar152._12_4_ = 0x42b0c0a5;
          auVar183 = vminps_avx(auVar183,auVar152);
          auVar97 = vmaxps_avx(auVar271,auVar183);
          auVar153._0_4_ = auVar97._0_4_ * 1.442695 + fVar290;
          auVar153._4_4_ = auVar97._4_4_ * 1.442695 + fVar291;
          auVar153._8_4_ = auVar97._8_4_ * 1.442695 + fVar292;
          auVar153._12_4_ = auVar97._12_4_ * 1.442695 + fVar293;
          auVar189._0_4_ = (int)auVar153._0_4_;
          auVar189._4_4_ = (int)auVar153._4_4_;
          auVar189._8_4_ = (int)auVar153._8_4_;
          auVar189._12_4_ = (int)auVar153._12_4_;
          auVar187 = vcvtdq2ps_avx(auVar189);
          auVar183 = vcmpps_avx(auVar153,auVar187,1);
          auVar183 = vandps_avx(auVar183,auVar99);
          auVar183 = vsubps_avx(auVar187,auVar183);
          auVar190._0_4_ = auVar183._0_4_ * 0.6931472;
          auVar190._4_4_ = auVar183._4_4_ * 0.6931472;
          auVar190._8_4_ = auVar183._8_4_ * 0.6931472;
          auVar190._12_4_ = auVar183._12_4_ * 0.6931472;
          auVar225 = ZEXT1664(auVar99);
          auVar187 = vsubps_avx(auVar97,auVar190);
          fVar95 = auVar187._0_4_;
          fVar139 = auVar187._4_4_;
          fVar140 = auVar187._8_4_;
          fVar141 = auVar187._12_4_;
          auVar94 = ZEXT864(0) << 0x20;
          auVar154._0_4_ = (int)auVar183._0_4_;
          auVar154._4_4_ = (int)auVar183._4_4_;
          auVar154._8_4_ = (int)auVar183._8_4_;
          auVar154._12_4_ = (int)auVar183._12_4_;
          auVar183 = vpslld_avx(auVar154,0x17);
          auVar183 = vpaddd_avx(auVar183,auVar99);
          auVar97._0_4_ =
               (fVar95 + fVar284 +
               fVar95 * fVar95 *
               (fVar290 +
               ((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                0.041665796) * fVar95 + 0.16666666) * fVar95)) * auVar183._0_4_ + fVar284;
          auVar97._4_4_ =
               (fVar139 + fVar287 +
               fVar139 * fVar139 *
               (fVar291 +
               ((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                0.041665796) * fVar139 + 0.16666666) * fVar139)) * auVar183._4_4_ + fVar287;
          auVar97._8_4_ =
               (fVar140 + fVar288 +
               fVar140 * fVar140 *
               (fVar292 +
               ((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                0.041665796) * fVar140 + 0.16666666) * fVar140)) * auVar183._8_4_ + fVar288;
          auVar97._12_4_ =
               (fVar141 + fVar289 +
               fVar141 * fVar141 *
               (fVar293 +
               ((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                0.041665796) * fVar141 + 0.16666666) * fVar141)) * auVar183._12_4_ + fVar289;
          auVar183 = vrcpps_avx(auVar97);
          fVar284 = auVar183._0_4_;
          fVar287 = auVar183._4_4_;
          fVar288 = auVar183._8_4_;
          fVar289 = auVar183._12_4_;
          auVar98._0_4_ = auVar97._0_4_ * (fVar284 + fVar284);
          auVar98._4_4_ = auVar97._4_4_ * (fVar287 + fVar287);
          auVar98._8_4_ = auVar97._8_4_ * (fVar288 + fVar288);
          auVar98._12_4_ = auVar97._12_4_ * (fVar289 + fVar289);
          auVar231._8_4_ = 0x40000000;
          auVar231._0_8_ = 0x4000000040000000;
          auVar231._12_4_ = 0x40000000;
          auVar183 = vsubps_avx(auVar231,auVar98);
          auVar99._0_4_ = fVar284 + fVar284 + -1.0 + fVar284 * auVar183._0_4_;
          auVar99._4_4_ = fVar287 + fVar287 + -1.0 + fVar287 * auVar183._4_4_;
          auVar99._8_4_ = fVar288 + fVar288 + -1.0 + fVar288 * auVar183._8_4_;
          auVar99._12_4_ = fVar289 + fVar289 + -1.0 + fVar289 * auVar183._12_4_;
          goto LAB_002e5958;
        case 6:
          fVar284 = **(float **)(&this->field_0xe8 + (long)p_Var20);
          fVar287 = (*(float **)(&this->field_0xe8 + (long)p_Var20))[1];
          auVar187._0_4_ = fVar284 * auVar227._0_4_ + fVar287;
          auVar187._4_4_ = fVar284 * auVar227._4_4_ + fVar287;
          auVar187._8_4_ = fVar284 * auVar227._8_4_ + fVar287;
          auVar187._12_4_ = fVar284 * auVar227._12_4_ + fVar287;
          auVar183 = vmaxps_avx(auVar187,auVar183);
          auVar99 = vminps_avx(auVar183,auVar99);
LAB_002e5958:
          auVar227._0_4_ = auVar99._0_4_ * auVar227._0_4_;
          auVar227._4_4_ = auVar99._4_4_ * auVar227._4_4_;
          auVar227._8_4_ = auVar99._8_4_ * auVar227._8_4_;
          auVar227._12_4_ = auVar99._12_4_ * auVar227._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar41 * 0x10) = auVar227;
        uVar41 = uVar41 + 1;
      } while (uVar41 != uVar40);
    }
    else {
      iVar38 = 0;
      if ((iVar44 != 8) || (iVar38 = 0, (int)uVar40 < 1)) goto LAB_002e6cef;
      uVar41 = 0;
      auVar225 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar94 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      do {
        fVar288 = 0.0;
        fVar289 = 0.0;
        fVar284 = 0.0;
        fVar287 = 0.0;
        fVar290 = 0.0;
        fVar291 = 0.0;
        fVar292 = 0.0;
        fVar293 = 0.0;
        if (lVar22 != 0) {
          pfVar45 = (float *)(lVar22 + uVar41 * 0x20);
          fVar284 = *pfVar45;
          fVar287 = pfVar45[1];
          fVar288 = pfVar45[2];
          fVar289 = pfVar45[3];
          fVar290 = pfVar45[4];
          fVar291 = pfVar45[5];
          fVar292 = pfVar45[6];
          fVar293 = pfVar45[7];
        }
        pfVar45 = (float *)((long)(this->weight_data_tm).w * uVar41 *
                            (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pfVar39 = (float *)local_f8._0_8_;
        if ((int)uVar57 < 8) {
          fVar146 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          fVar178 = 0.0;
          fVar179 = 0.0;
          fVar180 = 0.0;
          fVar259 = 0.0;
          fVar264 = 0.0;
          fVar265 = 0.0;
          fVar266 = 0.0;
          fVar267 = 0.0;
          fVar268 = 0.0;
          fVar269 = 0.0;
          fVar270 = 0.0;
          fVar181 = 0.0;
          fVar206 = 0.0;
          fVar207 = 0.0;
          fVar208 = 0.0;
          fVar209 = 0.0;
          fVar210 = 0.0;
          fVar211 = 0.0;
          fVar212 = 0.0;
          fVar245 = 0.0;
          fVar252 = 0.0;
          fVar253 = 0.0;
          fVar254 = 0.0;
          fVar255 = 0.0;
          fVar256 = 0.0;
          fVar257 = 0.0;
          fVar258 = 0.0;
          fVar294 = 0.0;
          fVar298 = 0.0;
          fVar299 = 0.0;
          fVar300 = 0.0;
          fVar301 = 0.0;
          fVar302 = 0.0;
          fVar303 = 0.0;
          fVar304 = 0.0;
          fVar95 = 0.0;
          fVar139 = 0.0;
          fVar140 = 0.0;
          fVar141 = 0.0;
          fVar142 = 0.0;
          fVar143 = 0.0;
          fVar144 = 0.0;
          fVar145 = 0.0;
          fVar226 = 0.0;
          fVar238 = 0.0;
          fVar239 = 0.0;
          fVar240 = 0.0;
          fVar241 = 0.0;
          fVar242 = 0.0;
          fVar243 = 0.0;
          fVar244 = 0.0;
          uVar54 = 0;
        }
        else {
          fVar226 = 0.0;
          fVar238 = 0.0;
          fVar239 = 0.0;
          fVar240 = 0.0;
          fVar241 = 0.0;
          fVar242 = 0.0;
          fVar243 = 0.0;
          fVar244 = 0.0;
          iVar38 = 7;
          fVar95 = 0.0;
          fVar139 = 0.0;
          fVar140 = 0.0;
          fVar141 = 0.0;
          fVar142 = 0.0;
          fVar143 = 0.0;
          fVar144 = 0.0;
          fVar145 = 0.0;
          fVar294 = 0.0;
          fVar298 = 0.0;
          fVar299 = 0.0;
          fVar300 = 0.0;
          fVar301 = 0.0;
          fVar302 = 0.0;
          fVar303 = 0.0;
          fVar304 = 0.0;
          fVar245 = 0.0;
          fVar252 = 0.0;
          fVar253 = 0.0;
          fVar254 = 0.0;
          fVar255 = 0.0;
          fVar256 = 0.0;
          fVar257 = 0.0;
          fVar258 = 0.0;
          fVar181 = 0.0;
          fVar206 = 0.0;
          fVar207 = 0.0;
          fVar208 = 0.0;
          fVar209 = 0.0;
          fVar210 = 0.0;
          fVar211 = 0.0;
          fVar212 = 0.0;
          fVar259 = 0.0;
          fVar264 = 0.0;
          fVar265 = 0.0;
          fVar266 = 0.0;
          fVar267 = 0.0;
          fVar268 = 0.0;
          fVar269 = 0.0;
          fVar270 = 0.0;
          fVar146 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          fVar178 = 0.0;
          fVar179 = 0.0;
          fVar180 = 0.0;
          do {
            fVar8 = *pfVar39;
            fVar9 = pfVar39[1];
            fVar10 = pfVar39[2];
            fVar11 = pfVar39[3];
            fVar284 = fVar8 * *pfVar45 + fVar284;
            fVar287 = fVar8 * pfVar45[1] + fVar287;
            fVar288 = fVar8 * pfVar45[2] + fVar288;
            fVar289 = fVar8 * pfVar45[3] + fVar289;
            fVar290 = fVar8 * pfVar45[4] + fVar290;
            fVar291 = fVar8 * pfVar45[5] + fVar291;
            fVar292 = fVar8 * pfVar45[6] + fVar292;
            fVar293 = fVar8 + fVar293;
            fVar226 = fVar9 * pfVar45[8] + fVar226;
            fVar238 = fVar9 * pfVar45[9] + fVar238;
            fVar239 = fVar9 * pfVar45[10] + fVar239;
            fVar240 = fVar9 * pfVar45[0xb] + fVar240;
            fVar241 = fVar9 * pfVar45[0xc] + fVar241;
            fVar242 = fVar9 * pfVar45[0xd] + fVar242;
            fVar243 = fVar9 * pfVar45[0xe] + fVar243;
            fVar244 = fVar9 + fVar244;
            fVar95 = fVar10 * pfVar45[0x10] + fVar95;
            fVar139 = fVar10 * pfVar45[0x11] + fVar139;
            fVar140 = fVar10 * pfVar45[0x12] + fVar140;
            fVar141 = fVar10 * pfVar45[0x13] + fVar141;
            fVar142 = fVar10 * pfVar45[0x14] + fVar142;
            fVar143 = fVar10 * pfVar45[0x15] + fVar143;
            fVar144 = fVar10 * pfVar45[0x16] + fVar144;
            fVar145 = fVar8 + fVar145;
            fVar294 = fVar11 * pfVar45[0x18] + fVar294;
            fVar298 = fVar11 * pfVar45[0x19] + fVar298;
            fVar299 = fVar11 * pfVar45[0x1a] + fVar299;
            fVar300 = fVar11 * pfVar45[0x1b] + fVar300;
            fVar301 = fVar11 * pfVar45[0x1c] + fVar301;
            fVar302 = fVar11 * pfVar45[0x1d] + fVar302;
            fVar303 = fVar11 * pfVar45[0x1e] + fVar303;
            fVar304 = fVar8 + fVar304;
            fVar8 = pfVar39[4];
            fVar9 = pfVar39[5];
            fVar10 = pfVar39[6];
            fVar11 = pfVar39[7];
            fVar245 = fVar8 * pfVar45[0x20] + fVar245;
            fVar252 = fVar8 * pfVar45[0x21] + fVar252;
            fVar253 = fVar8 * pfVar45[0x22] + fVar253;
            fVar254 = fVar8 * pfVar45[0x23] + fVar254;
            fVar255 = fVar8 * pfVar45[0x24] + fVar255;
            fVar256 = fVar8 * pfVar45[0x25] + fVar256;
            fVar257 = fVar8 * pfVar45[0x26] + fVar257;
            fVar258 = fVar8 + fVar258;
            fVar181 = fVar9 * pfVar45[0x28] + fVar181;
            fVar206 = fVar9 * pfVar45[0x29] + fVar206;
            fVar207 = fVar9 * pfVar45[0x2a] + fVar207;
            fVar208 = fVar9 * pfVar45[0x2b] + fVar208;
            fVar209 = fVar9 * pfVar45[0x2c] + fVar209;
            fVar210 = fVar9 * pfVar45[0x2d] + fVar210;
            fVar211 = fVar9 * pfVar45[0x2e] + fVar211;
            fVar212 = fVar9 + fVar212;
            fVar259 = fVar10 * pfVar45[0x30] + fVar259;
            fVar264 = fVar10 * pfVar45[0x31] + fVar264;
            fVar265 = fVar10 * pfVar45[0x32] + fVar265;
            fVar266 = fVar10 * pfVar45[0x33] + fVar266;
            fVar267 = fVar10 * pfVar45[0x34] + fVar267;
            fVar268 = fVar10 * pfVar45[0x35] + fVar268;
            fVar269 = fVar10 * pfVar45[0x36] + fVar269;
            fVar270 = fVar8 + fVar270;
            fVar146 = fVar11 * pfVar45[0x38] + fVar146;
            fVar174 = fVar11 * pfVar45[0x39] + fVar174;
            fVar175 = fVar11 * pfVar45[0x3a] + fVar175;
            fVar176 = fVar11 * pfVar45[0x3b] + fVar176;
            fVar177 = fVar11 * pfVar45[0x3c] + fVar177;
            fVar178 = fVar11 * pfVar45[0x3d] + fVar178;
            fVar179 = fVar11 * pfVar45[0x3e] + fVar179;
            fVar180 = fVar8 + fVar180;
            pfVar39 = pfVar39 + 8;
            pfVar45 = pfVar45 + 0x40;
            iVar38 = iVar38 + 8;
            uVar54 = uVar57 & 0xfffffff8;
          } while (iVar38 < (int)uVar57);
        }
        uVar52 = uVar54 | 3;
        while ((int)uVar52 < (int)uVar57) {
          fVar8 = *pfVar39;
          fVar9 = pfVar39[1];
          fVar10 = pfVar39[2];
          fVar11 = pfVar39[3];
          fVar284 = fVar8 * *pfVar45 + fVar284;
          fVar287 = fVar8 * pfVar45[1] + fVar287;
          fVar288 = fVar8 * pfVar45[2] + fVar288;
          fVar289 = fVar8 * pfVar45[3] + fVar289;
          fVar290 = fVar8 * pfVar45[4] + fVar290;
          fVar291 = fVar8 * pfVar45[5] + fVar291;
          fVar292 = fVar8 * pfVar45[6] + fVar292;
          fVar293 = fVar8 + fVar293;
          fVar226 = fVar9 * pfVar45[8] + fVar226;
          fVar238 = fVar9 * pfVar45[9] + fVar238;
          fVar239 = fVar9 * pfVar45[10] + fVar239;
          fVar240 = fVar9 * pfVar45[0xb] + fVar240;
          fVar241 = fVar9 * pfVar45[0xc] + fVar241;
          fVar242 = fVar9 * pfVar45[0xd] + fVar242;
          fVar243 = fVar9 * pfVar45[0xe] + fVar243;
          fVar244 = fVar8 + fVar244;
          fVar95 = fVar10 * pfVar45[0x10] + fVar95;
          fVar139 = fVar10 * pfVar45[0x11] + fVar139;
          fVar140 = fVar10 * pfVar45[0x12] + fVar140;
          fVar141 = fVar10 * pfVar45[0x13] + fVar141;
          fVar142 = fVar10 * pfVar45[0x14] + fVar142;
          fVar143 = fVar10 * pfVar45[0x15] + fVar143;
          fVar144 = fVar10 * pfVar45[0x16] + fVar144;
          fVar145 = fVar8 + fVar145;
          fVar294 = fVar11 * pfVar45[0x18] + fVar294;
          fVar298 = fVar11 * pfVar45[0x19] + fVar298;
          fVar299 = fVar11 * pfVar45[0x1a] + fVar299;
          fVar300 = fVar11 * pfVar45[0x1b] + fVar300;
          fVar301 = fVar11 * pfVar45[0x1c] + fVar301;
          fVar302 = fVar11 * pfVar45[0x1d] + fVar302;
          fVar303 = fVar11 * pfVar45[0x1e] + fVar303;
          fVar304 = fVar9 + fVar304;
          pfVar39 = pfVar39 + 4;
          pfVar45 = pfVar45 + 0x20;
          uVar52 = uVar54 + 7;
          uVar54 = uVar54 + 4;
        }
        if (uVar57 - uVar54 != 0 && (int)uVar54 <= (int)uVar57) {
          lVar50 = 0;
          do {
            fVar8 = pfVar39[lVar50];
            fVar284 = fVar8 * *pfVar45 + fVar284;
            fVar287 = fVar8 * pfVar45[1] + fVar287;
            fVar288 = fVar8 * pfVar45[2] + fVar288;
            fVar289 = fVar8 * pfVar45[3] + fVar289;
            fVar290 = fVar8 * pfVar45[4] + fVar290;
            fVar291 = fVar8 * pfVar45[5] + fVar291;
            fVar292 = fVar8 * pfVar45[6] + fVar292;
            fVar293 = fVar8 + fVar293;
            pfVar45 = pfVar45 + 8;
            lVar50 = lVar50 + 1;
          } while (uVar57 - uVar54 != (int)lVar50);
        }
        fVar284 = fVar284 + fVar259 + fVar146 + fVar245 + fVar181 + fVar294 + fVar95 + fVar226;
        fVar287 = fVar287 + fVar264 + fVar174 + fVar252 + fVar206 + fVar298 + fVar139 + fVar238;
        auVar119._0_8_ = CONCAT44(fVar287,fVar284);
        auVar119._8_4_ =
             fVar288 + fVar265 + fVar175 + fVar253 + fVar207 + fVar299 + fVar140 + fVar239;
        auVar119._12_4_ =
             fVar289 + fVar266 + fVar176 + fVar254 + fVar208 + fVar300 + fVar141 + fVar240;
        auVar119._16_4_ =
             fVar290 + fVar267 + fVar177 + fVar255 + fVar209 + fVar301 + fVar142 + fVar241;
        auVar119._20_4_ =
             fVar291 + fVar268 + fVar178 + fVar256 + fVar210 + fVar302 + fVar143 + fVar242;
        auVar119._24_4_ =
             fVar292 + fVar269 + fVar179 + fVar257 + fVar211 + fVar303 + fVar144 + fVar243;
        auVar119._28_4_ =
             fVar293 + fVar270 + fVar180 + fVar258 + fVar212 + fVar304 + fVar145 + fVar244;
        auVar85 = auVar94._0_32_;
        fVar291 = auVar225._4_4_;
        fVar293 = auVar225._8_4_;
        fVar95 = auVar225._12_4_;
        fVar140 = auVar225._16_4_;
        fVar142 = auVar225._20_4_;
        fVar144 = auVar225._24_4_;
        fVar238 = auVar225._28_4_;
        fVar289 = auVar94._0_4_;
        fVar290 = auVar94._4_4_;
        fVar292 = auVar94._8_4_;
        fVar139 = auVar94._12_4_;
        fVar141 = auVar94._16_4_;
        fVar143 = auVar94._20_4_;
        fVar145 = auVar94._24_4_;
        fVar226 = auVar94._28_4_;
        fVar288 = auVar225._0_4_;
        switch(uVar19) {
        case 1:
          auVar119 = vmaxps_avx(auVar119,_DAT_00557f80);
          break;
        case 2:
          auVar85 = vmaxps_avx(auVar119,ZEXT1632(ZEXT816(0) << 0x40));
          auVar168 = vminps_avx(auVar119,ZEXT1632(ZEXT816(0) << 0x40));
          fVar284 = **(float **)(&this->field_0xe8 + (long)p_Var20);
          auVar119._0_4_ = fVar284 * auVar168._0_4_ + auVar85._0_4_;
          auVar119._4_4_ = fVar284 * auVar168._4_4_ + auVar85._4_4_;
          auVar119._8_4_ = fVar284 * auVar168._8_4_ + auVar85._8_4_;
          auVar119._12_4_ = fVar284 * auVar168._12_4_ + auVar85._12_4_;
          auVar119._16_4_ = fVar284 * auVar168._16_4_ + auVar85._16_4_;
          auVar119._20_4_ = fVar284 * auVar168._20_4_ + auVar85._20_4_;
          auVar119._24_4_ = fVar284 * auVar168._24_4_ + auVar85._24_4_;
          auVar119._28_4_ = auVar168._28_4_ + auVar85._28_4_;
          break;
        case 3:
          uVar12 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var20);
          auVar163._4_4_ = uVar12;
          auVar163._0_4_ = uVar12;
          auVar163._8_4_ = uVar12;
          auVar163._12_4_ = uVar12;
          auVar163._16_4_ = uVar12;
          auVar163._20_4_ = uVar12;
          auVar163._24_4_ = uVar12;
          auVar163._28_4_ = uVar12;
          uVar12 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var20))[1];
          auVar203._4_4_ = uVar12;
          auVar203._0_4_ = uVar12;
          auVar203._8_4_ = uVar12;
          auVar203._12_4_ = uVar12;
          auVar203._16_4_ = uVar12;
          auVar203._20_4_ = uVar12;
          auVar203._24_4_ = uVar12;
          auVar203._28_4_ = uVar12;
          auVar85 = vmaxps_avx(auVar119,auVar163);
          auVar119 = vminps_avx(auVar85,auVar203);
          break;
        case 4:
          auVar120._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
          auVar120._8_4_ = -auVar119._8_4_;
          auVar120._12_4_ = -auVar119._12_4_;
          auVar120._16_4_ = -auVar119._16_4_;
          auVar120._20_4_ = -auVar119._20_4_;
          auVar120._24_4_ = -auVar119._24_4_;
          auVar120._28_4_ = -auVar119._28_4_;
          auVar164._8_4_ = 0x42b0c0a5;
          auVar164._0_8_ = 0x42b0c0a542b0c0a5;
          auVar164._12_4_ = 0x42b0c0a5;
          auVar164._16_4_ = 0x42b0c0a5;
          auVar164._20_4_ = 0x42b0c0a5;
          auVar164._24_4_ = 0x42b0c0a5;
          auVar164._28_4_ = 0x42b0c0a5;
          auVar119 = vminps_avx(auVar120,auVar164);
          auVar165._8_4_ = 0xc2b0c0a5;
          auVar165._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar165._12_4_ = 0xc2b0c0a5;
          auVar165._16_4_ = 0xc2b0c0a5;
          auVar165._20_4_ = 0xc2b0c0a5;
          auVar165._24_4_ = 0xc2b0c0a5;
          auVar165._28_4_ = 0xc2b0c0a5;
          auVar168 = vmaxps_avx(auVar119,auVar165);
          auVar166._0_4_ = auVar168._0_4_ * 1.442695 + fVar288;
          auVar166._4_4_ = auVar168._4_4_ * 1.442695 + fVar291;
          auVar166._8_4_ = auVar168._8_4_ * 1.442695 + fVar293;
          auVar166._12_4_ = auVar168._12_4_ * 1.442695 + fVar95;
          auVar166._16_4_ = auVar168._16_4_ * 1.442695 + fVar140;
          auVar166._20_4_ = auVar168._20_4_ * 1.442695 + fVar142;
          auVar166._24_4_ = auVar168._24_4_ * 1.442695 + fVar144;
          auVar166._28_4_ = fVar238 + 1.442695;
          auVar27 = vroundps_avx(auVar166,1);
          auVar119 = vcmpps_avx(auVar166,auVar27,1);
          auVar119 = vandps_avx(auVar119,auVar85);
          auVar119 = vsubps_avx(auVar27,auVar119);
          fVar284 = auVar168._0_4_ + auVar119._0_4_ * -0.6931472;
          fVar287 = auVar168._4_4_ + auVar119._4_4_ * -0.6931472;
          fVar238 = auVar168._8_4_ + auVar119._8_4_ * -0.6931472;
          fVar239 = auVar168._12_4_ + auVar119._12_4_ * -0.6931472;
          fVar240 = auVar168._16_4_ + auVar119._16_4_ * -0.6931472;
          fVar241 = auVar168._20_4_ + auVar119._20_4_ * -0.6931472;
          fVar242 = auVar168._24_4_ + auVar119._24_4_ * -0.6931472;
          auVar147._0_4_ = (int)auVar119._0_4_;
          auVar147._4_4_ = (int)auVar119._4_4_;
          auVar147._8_4_ = (int)auVar119._8_4_;
          auVar147._12_4_ = (int)auVar119._12_4_;
          auVar167._16_4_ = (int)auVar119._16_4_;
          auVar167._0_16_ = auVar147;
          auVar167._20_4_ = (int)auVar119._20_4_;
          auVar167._24_4_ = (int)auVar119._24_4_;
          auVar167._28_4_ = (int)auVar119._28_4_;
          auVar227 = vpslld_avx(auVar147,0x17);
          auVar183 = vpslld_avx(auVar167._16_16_,0x17);
          auVar58._8_4_ = 0x3f800000;
          auVar58._0_8_ = 0x3f8000003f800000;
          auVar58._12_4_ = 0x3f800000;
          auVar183 = vpaddd_avx(auVar183,auVar58);
          auVar227 = vpaddd_avx(auVar227,auVar58);
          auVar121._0_4_ =
               (fVar284 + fVar289 +
               fVar284 * fVar284 *
               (((((fVar284 * 0.00019875691 + 0.0013981999) * fVar284 + 0.008333452) * fVar284 +
                 0.041665796) * fVar284 + 0.16666666) * fVar284 + fVar288)) * auVar227._0_4_ +
               fVar289;
          auVar121._4_4_ =
               (fVar287 + fVar290 +
               fVar287 * fVar287 *
               (((((fVar287 * 0.00019875691 + 0.0013981999) * fVar287 + 0.008333452) * fVar287 +
                 0.041665796) * fVar287 + 0.16666666) * fVar287 + fVar291)) * auVar227._4_4_ +
               fVar290;
          auVar121._8_4_ =
               (fVar238 + fVar292 +
               fVar238 * fVar238 *
               (((((fVar238 * 0.00019875691 + 0.0013981999) * fVar238 + 0.008333452) * fVar238 +
                 0.041665796) * fVar238 + 0.16666666) * fVar238 + fVar293)) * auVar227._8_4_ +
               fVar292;
          auVar121._12_4_ =
               (fVar239 + fVar139 +
               fVar239 * fVar239 *
               (((((fVar239 * 0.00019875691 + 0.0013981999) * fVar239 + 0.008333452) * fVar239 +
                 0.041665796) * fVar239 + 0.16666666) * fVar239 + fVar95)) * auVar227._12_4_ +
               fVar139;
          auVar121._16_4_ =
               (fVar240 + fVar141 +
               fVar240 * fVar240 *
               (((((fVar240 * 0.00019875691 + 0.0013981999) * fVar240 + 0.008333452) * fVar240 +
                 0.041665796) * fVar240 + 0.16666666) * fVar240 + fVar140)) * auVar183._0_4_ +
               fVar141;
          auVar121._20_4_ =
               (fVar241 + fVar143 +
               fVar241 * fVar241 *
               (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                 0.041665796) * fVar241 + 0.16666666) * fVar241 + fVar142)) * auVar183._4_4_ +
               fVar143;
          auVar121._24_4_ =
               (fVar242 + fVar145 +
               fVar242 * fVar242 *
               (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                 0.041665796) * fVar242 + 0.16666666) * fVar242 + fVar144)) * auVar183._8_4_ +
               fVar145;
          auVar121._28_4_ = auVar168._28_4_ + -0.6931472 + fVar226 + -0.6931472 + fVar226;
          auVar168 = vrcpps_avx(auVar121);
          fVar284 = auVar168._0_4_;
          fVar287 = auVar168._4_4_;
          auVar30._4_4_ = auVar121._4_4_ * fVar287;
          auVar30._0_4_ = auVar121._0_4_ * fVar284;
          fVar288 = auVar168._8_4_;
          auVar30._8_4_ = auVar121._8_4_ * fVar288;
          fVar289 = auVar168._12_4_;
          auVar30._12_4_ = auVar121._12_4_ * fVar289;
          fVar290 = auVar168._16_4_;
          auVar30._16_4_ = auVar121._16_4_ * fVar290;
          fVar291 = auVar168._20_4_;
          auVar30._20_4_ = auVar121._20_4_ * fVar291;
          fVar292 = auVar168._24_4_;
          auVar30._24_4_ = auVar121._24_4_ * fVar292;
          auVar30._28_4_ = auVar121._28_4_;
          auVar85 = vsubps_avx(auVar85,auVar30);
          auVar119._0_4_ = fVar284 + fVar284 * auVar85._0_4_;
          auVar119._4_4_ = fVar287 + fVar287 * auVar85._4_4_;
          auVar119._8_4_ = fVar288 + fVar288 * auVar85._8_4_;
          auVar119._12_4_ = fVar289 + fVar289 * auVar85._12_4_;
          auVar119._16_4_ = fVar290 + fVar290 * auVar85._16_4_;
          auVar119._20_4_ = fVar291 + fVar291 * auVar85._20_4_;
          auVar119._24_4_ = fVar292 + fVar292 * auVar85._24_4_;
          auVar119._28_4_ = auVar168._28_4_ + auVar85._28_4_;
          break;
        case 5:
          auVar276._8_4_ = 0x42b0c0a5;
          auVar276._0_8_ = 0x42b0c0a542b0c0a5;
          auVar276._12_4_ = 0x42b0c0a5;
          auVar276._16_4_ = 0x42b0c0a5;
          auVar276._20_4_ = 0x42b0c0a5;
          auVar276._24_4_ = 0x42b0c0a5;
          auVar276._28_4_ = 0x42b0c0a5;
          auVar168 = vminps_avx(auVar276,auVar119);
          auVar281._8_4_ = 0xc2b0c0a5;
          auVar281._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar281._12_4_ = 0xc2b0c0a5;
          auVar281._16_4_ = 0xc2b0c0a5;
          auVar281._20_4_ = 0xc2b0c0a5;
          auVar281._24_4_ = 0xc2b0c0a5;
          auVar281._28_4_ = 0xc2b0c0a5;
          auVar27 = vmaxps_avx(auVar281,auVar168);
          auVar195._0_4_ = auVar27._0_4_ * 1.442695 + fVar288;
          auVar195._4_4_ = auVar27._4_4_ * 1.442695 + fVar291;
          auVar195._8_4_ = auVar27._8_4_ * 1.442695 + fVar293;
          auVar195._12_4_ = auVar27._12_4_ * 1.442695 + fVar95;
          auVar195._16_4_ = auVar27._16_4_ * 1.442695 + fVar140;
          auVar195._20_4_ = auVar27._20_4_ * 1.442695 + fVar142;
          auVar195._24_4_ = auVar27._24_4_ * 1.442695 + fVar144;
          auVar195._28_4_ = fVar258 + fVar212 + fVar238;
          auVar65 = vroundps_avx(auVar195,1);
          auVar168 = vcmpps_avx(auVar195,auVar65,1);
          auVar168 = vandps_avx(auVar168,auVar85);
          auVar168 = vsubps_avx(auVar65,auVar168);
          auVar25._4_4_ = auVar168._4_4_ * 0.6931472;
          auVar25._0_4_ = auVar168._0_4_ * 0.6931472;
          auVar25._8_4_ = auVar168._8_4_ * 0.6931472;
          auVar25._12_4_ = auVar168._12_4_ * 0.6931472;
          auVar25._16_4_ = auVar168._16_4_ * 0.6931472;
          auVar25._20_4_ = auVar168._20_4_ * 0.6931472;
          auVar25._24_4_ = auVar168._24_4_ * 0.6931472;
          auVar25._28_4_ = auVar65._28_4_;
          auVar27 = vsubps_avx(auVar27,auVar25);
          fVar239 = auVar27._0_4_;
          fVar240 = auVar27._4_4_;
          fVar241 = auVar27._8_4_;
          fVar242 = auVar27._12_4_;
          fVar243 = auVar27._16_4_;
          fVar244 = auVar27._20_4_;
          fVar294 = auVar27._24_4_;
          auVar182._0_4_ = (int)auVar168._0_4_;
          auVar182._4_4_ = (int)auVar168._4_4_;
          auVar182._8_4_ = (int)auVar168._8_4_;
          auVar182._12_4_ = (int)auVar168._12_4_;
          auVar196._16_4_ = (int)auVar168._16_4_;
          auVar196._0_16_ = auVar182;
          auVar196._20_4_ = (int)auVar168._20_4_;
          auVar196._24_4_ = (int)auVar168._24_4_;
          auVar196._28_4_ = (int)auVar168._28_4_;
          auVar227 = vpslld_avx(auVar182,0x17);
          auVar183 = vpslld_avx(auVar196._16_16_,0x17);
          auVar213._8_4_ = 0x3f800000;
          auVar213._0_8_ = 0x3f8000003f800000;
          auVar213._12_4_ = 0x3f800000;
          auVar183 = vpaddd_avx(auVar183,auVar213);
          auVar227 = vpaddd_avx(auVar227,auVar213);
          auVar161._0_4_ =
               (fVar239 + fVar289 +
               (((((fVar239 * 0.00019875691 + 0.0013981999) * fVar239 + 0.008333452) * fVar239 +
                 0.041665796) * fVar239 + 0.16666666) * fVar239 + fVar288) * fVar239 * fVar239) *
               auVar227._0_4_ + fVar289;
          auVar161._4_4_ =
               (fVar240 + fVar290 +
               (((((fVar240 * 0.00019875691 + 0.0013981999) * fVar240 + 0.008333452) * fVar240 +
                 0.041665796) * fVar240 + 0.16666666) * fVar240 + fVar291) * fVar240 * fVar240) *
               auVar227._4_4_ + fVar290;
          auVar161._8_4_ =
               (fVar241 + fVar292 +
               (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                 0.041665796) * fVar241 + 0.16666666) * fVar241 + fVar293) * fVar241 * fVar241) *
               auVar227._8_4_ + fVar292;
          auVar161._12_4_ =
               (fVar242 + fVar139 +
               (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                 0.041665796) * fVar242 + 0.16666666) * fVar242 + fVar95) * fVar242 * fVar242) *
               auVar227._12_4_ + fVar139;
          auVar161._16_4_ =
               (fVar243 + fVar141 +
               (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                 0.041665796) * fVar243 + 0.16666666) * fVar243 + fVar140) * fVar243 * fVar243) *
               auVar183._0_4_ + fVar141;
          auVar161._20_4_ =
               (fVar244 + fVar143 +
               (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                 0.041665796) * fVar244 + 0.16666666) * fVar244 + fVar142) * fVar244 * fVar244) *
               auVar183._4_4_ + fVar143;
          auVar161._24_4_ =
               (fVar294 + fVar145 +
               (((((fVar294 * 0.00019875691 + 0.0013981999) * fVar294 + 0.008333452) * fVar294 +
                 0.041665796) * fVar294 + 0.16666666) * fVar294 + fVar144) * fVar294 * fVar294) *
               auVar183._8_4_ + fVar145;
          auVar161._28_4_ = auVar27._28_4_ + fVar226 + auVar65._28_4_ + fVar226;
          auVar197._8_4_ = 0x800000;
          auVar197._0_8_ = 0x80000000800000;
          auVar197._12_4_ = 0x800000;
          auVar197._16_4_ = 0x800000;
          auVar197._20_4_ = 0x800000;
          auVar197._24_4_ = 0x800000;
          auVar197._28_4_ = 0x800000;
          auVar65 = vmaxps_avx(auVar161,auVar197);
          auVar183 = vpsrld_avx(auVar65._16_16_,0x17);
          auVar198._8_4_ = 0x807fffff;
          auVar198._0_8_ = 0x807fffff807fffff;
          auVar198._12_4_ = 0x807fffff;
          auVar198._16_4_ = 0x807fffff;
          auVar198._20_4_ = 0x807fffff;
          auVar198._24_4_ = 0x807fffff;
          auVar198._28_4_ = 0x807fffff;
          auVar168 = vandps_avx(auVar65,auVar198);
          auVar25 = vorps_avx(auVar168,auVar225._0_32_);
          auVar223._8_4_ = 0x3f3504f3;
          auVar223._0_8_ = 0x3f3504f33f3504f3;
          auVar223._12_4_ = 0x3f3504f3;
          auVar223._16_4_ = 0x3f3504f3;
          auVar223._20_4_ = 0x3f3504f3;
          auVar223._24_4_ = 0x3f3504f3;
          auVar223._28_4_ = 0x3f3504f3;
          auVar27 = vcmpps_avx(auVar223,auVar25,2);
          auVar168 = vandnps_avx(auVar27,auVar25);
          fVar239 = auVar168._0_4_ + auVar25._0_4_ + -1.0;
          fVar240 = auVar168._4_4_ + auVar25._4_4_ + -1.0;
          fVar241 = auVar168._8_4_ + auVar25._8_4_ + -1.0;
          fVar242 = auVar168._12_4_ + auVar25._12_4_ + -1.0;
          fVar243 = auVar168._16_4_ + auVar25._16_4_ + -1.0;
          fVar244 = auVar168._20_4_ + auVar25._20_4_ + -1.0;
          fVar294 = auVar168._24_4_ + auVar25._24_4_ + -1.0;
          auVar183 = vpsubd_avx(auVar183,auVar27._16_16_);
          auVar227 = vpsrld_avx(auVar65._0_16_,0x17);
          auVar219._8_4_ = 0xffffff81;
          auVar219._0_8_ = 0xffffff81ffffff81;
          auVar219._12_4_ = 0xffffff81;
          auVar183 = vpaddd_avx(auVar183,auVar219);
          auVar227 = vpsubd_avx(auVar227,auVar27._0_16_);
          auVar227 = vpaddd_avx(auVar227,auVar219);
          auVar233._16_16_ = auVar183;
          auVar233._0_16_ = auVar227;
          auVar27 = vcmpps_avx(auVar161,_DAT_00557f80,2);
          auVar65 = vcvtdq2ps_avx(auVar233);
          auVar28._4_4_ =
               (fVar240 * fVar240 *
                (((((((((fVar240 * 0.070376836 + -0.1151461) * fVar240 + 0.116769984) * fVar240 +
                      -0.12420141) * fVar240 + 0.14249323) * fVar240 + -0.16668057) * fVar240 +
                   0.20000714) * fVar240 + -0.24999994) * fVar240 + 0.3333333) * fVar240 + -0.5) +
               auVar65._4_4_ * 0.6931472 + fVar240) * -2.0;
          auVar28._0_4_ =
               (fVar239 * fVar239 *
                (((((((((fVar239 * 0.070376836 + -0.1151461) * fVar239 + 0.116769984) * fVar239 +
                      -0.12420141) * fVar239 + 0.14249323) * fVar239 + -0.16668057) * fVar239 +
                   0.20000714) * fVar239 + -0.24999994) * fVar239 + 0.3333333) * fVar239 + -0.5) +
               auVar65._0_4_ * 0.6931472 + fVar239) * -2.0;
          auVar28._8_4_ =
               (fVar241 * fVar241 *
                (((((((((fVar241 * 0.070376836 + -0.1151461) * fVar241 + 0.116769984) * fVar241 +
                      -0.12420141) * fVar241 + 0.14249323) * fVar241 + -0.16668057) * fVar241 +
                   0.20000714) * fVar241 + -0.24999994) * fVar241 + 0.3333333) * fVar241 + -0.5) +
               auVar65._8_4_ * 0.6931472 + fVar241) * -2.0;
          auVar28._12_4_ =
               (fVar242 * fVar242 *
                (((((((((fVar242 * 0.070376836 + -0.1151461) * fVar242 + 0.116769984) * fVar242 +
                      -0.12420141) * fVar242 + 0.14249323) * fVar242 + -0.16668057) * fVar242 +
                   0.20000714) * fVar242 + -0.24999994) * fVar242 + 0.3333333) * fVar242 + -0.5) +
               auVar65._12_4_ * 0.6931472 + fVar242) * -2.0;
          auVar28._16_4_ =
               (fVar243 * fVar243 *
                (((((((((fVar243 * 0.070376836 + -0.1151461) * fVar243 + 0.116769984) * fVar243 +
                      -0.12420141) * fVar243 + 0.14249323) * fVar243 + -0.16668057) * fVar243 +
                   0.20000714) * fVar243 + -0.24999994) * fVar243 + 0.3333333) * fVar243 + -0.5) +
               auVar65._16_4_ * 0.6931472 + fVar243) * -2.0;
          auVar28._20_4_ =
               (fVar244 * fVar244 *
                (((((((((fVar244 * 0.070376836 + -0.1151461) * fVar244 + 0.116769984) * fVar244 +
                      -0.12420141) * fVar244 + 0.14249323) * fVar244 + -0.16668057) * fVar244 +
                   0.20000714) * fVar244 + -0.24999994) * fVar244 + 0.3333333) * fVar244 + -0.5) +
               auVar65._20_4_ * 0.6931472 + fVar244) * -2.0;
          auVar28._24_4_ =
               (fVar294 * fVar294 *
                (((((((((fVar294 * 0.070376836 + -0.1151461) * fVar294 + 0.116769984) * fVar294 +
                      -0.12420141) * fVar294 + 0.14249323) * fVar294 + -0.16668057) * fVar294 +
                   0.20000714) * fVar294 + -0.24999994) * fVar294 + 0.3333333) * fVar294 + -0.5) +
               auVar65._24_4_ * 0.6931472 + fVar294) * -2.0;
          auVar28._28_4_ = auVar65._28_4_ + auVar168._28_4_ + auVar25._28_4_ + -1.0 + 0.0;
          auVar224._8_4_ = 0x7fffffff;
          auVar224._0_8_ = 0x7fffffff7fffffff;
          auVar224._12_4_ = 0x7fffffff;
          auVar224._16_4_ = 0x7fffffff;
          auVar224._20_4_ = 0x7fffffff;
          auVar224._24_4_ = 0x7fffffff;
          auVar224._28_4_ = 0x7fffffff;
          auVar168 = vblendvps_avx(auVar28,auVar224,auVar27);
          auVar199._8_4_ = 0x42b0c0a5;
          auVar199._0_8_ = 0x42b0c0a542b0c0a5;
          auVar199._12_4_ = 0x42b0c0a5;
          auVar199._16_4_ = 0x42b0c0a5;
          auVar199._20_4_ = 0x42b0c0a5;
          auVar199._24_4_ = 0x42b0c0a5;
          auVar199._28_4_ = 0x42b0c0a5;
          auVar168 = vminps_avx(auVar168,auVar199);
          auVar200._8_4_ = 0xc2b0c0a5;
          auVar200._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar200._12_4_ = 0xc2b0c0a5;
          auVar200._16_4_ = 0xc2b0c0a5;
          auVar200._20_4_ = 0xc2b0c0a5;
          auVar200._24_4_ = 0xc2b0c0a5;
          auVar200._28_4_ = 0xc2b0c0a5;
          auVar27 = vmaxps_avx(auVar168,auVar200);
          auVar201._0_4_ = auVar27._0_4_ * 1.442695 + fVar288;
          auVar201._4_4_ = auVar27._4_4_ * 1.442695 + fVar291;
          auVar201._8_4_ = auVar27._8_4_ * 1.442695 + fVar293;
          auVar201._12_4_ = auVar27._12_4_ * 1.442695 + fVar95;
          auVar201._16_4_ = auVar27._16_4_ * 1.442695 + fVar140;
          auVar201._20_4_ = auVar27._20_4_ * 1.442695 + fVar142;
          auVar201._24_4_ = auVar27._24_4_ * 1.442695 + fVar144;
          auVar201._28_4_ = fVar238 + 1.442695;
          auVar65 = vroundps_avx(auVar201,1);
          auVar168 = vcmpps_avx(auVar201,auVar65,1);
          auVar168 = vandps_avx(auVar168,auVar85);
          auVar168 = vsubps_avx(auVar65,auVar168);
          auVar29._4_4_ = auVar168._4_4_ * 0.6931472;
          auVar29._0_4_ = auVar168._0_4_ * 0.6931472;
          auVar29._8_4_ = auVar168._8_4_ * 0.6931472;
          auVar29._12_4_ = auVar168._12_4_ * 0.6931472;
          auVar29._16_4_ = auVar168._16_4_ * 0.6931472;
          auVar29._20_4_ = auVar168._20_4_ * 0.6931472;
          auVar29._24_4_ = auVar168._24_4_ * 0.6931472;
          auVar29._28_4_ = auVar65._28_4_;
          auVar27 = vsubps_avx(auVar27,auVar29);
          fVar238 = auVar27._0_4_;
          fVar239 = auVar27._4_4_;
          fVar240 = auVar27._8_4_;
          fVar241 = auVar27._12_4_;
          fVar242 = auVar27._16_4_;
          fVar243 = auVar27._20_4_;
          fVar244 = auVar27._24_4_;
          auVar225 = ZEXT3264(auVar225._0_32_);
          auVar94 = ZEXT3264(auVar85);
          auVar184._0_4_ = (int)auVar168._0_4_;
          auVar184._4_4_ = (int)auVar168._4_4_;
          auVar184._8_4_ = (int)auVar168._8_4_;
          auVar184._12_4_ = (int)auVar168._12_4_;
          auVar202._16_4_ = (int)auVar168._16_4_;
          auVar202._0_16_ = auVar184;
          auVar202._20_4_ = (int)auVar168._20_4_;
          auVar202._24_4_ = (int)auVar168._24_4_;
          auVar202._28_4_ = (int)auVar168._28_4_;
          auVar227 = vpslld_avx(auVar184,0x17);
          auVar183 = vpslld_avx(auVar202._16_16_,0x17);
          auVar183 = vpaddd_avx(auVar183,auVar213);
          auVar227 = vpaddd_avx(auVar227,auVar213);
          auVar162._0_4_ =
               (fVar238 + fVar289 +
               (((((fVar238 * 0.00019875691 + 0.0013981999) * fVar238 + 0.008333452) * fVar238 +
                 0.041665796) * fVar238 + 0.16666666) * fVar238 + fVar288) * fVar238 * fVar238) *
               auVar227._0_4_ + fVar289;
          auVar162._4_4_ =
               (fVar239 + fVar290 +
               (((((fVar239 * 0.00019875691 + 0.0013981999) * fVar239 + 0.008333452) * fVar239 +
                 0.041665796) * fVar239 + 0.16666666) * fVar239 + fVar291) * fVar239 * fVar239) *
               auVar227._4_4_ + fVar290;
          auVar162._8_4_ =
               (fVar240 + fVar292 +
               (((((fVar240 * 0.00019875691 + 0.0013981999) * fVar240 + 0.008333452) * fVar240 +
                 0.041665796) * fVar240 + 0.16666666) * fVar240 + fVar293) * fVar240 * fVar240) *
               auVar227._8_4_ + fVar292;
          auVar162._12_4_ =
               (fVar241 + fVar139 +
               (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                 0.041665796) * fVar241 + 0.16666666) * fVar241 + fVar95) * fVar241 * fVar241) *
               auVar227._12_4_ + fVar139;
          auVar162._16_4_ =
               (fVar242 + fVar141 +
               (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                 0.041665796) * fVar242 + 0.16666666) * fVar242 + fVar140) * fVar242 * fVar242) *
               auVar183._0_4_ + fVar141;
          auVar162._20_4_ =
               (fVar243 + fVar143 +
               (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                 0.041665796) * fVar243 + 0.16666666) * fVar243 + fVar142) * fVar243 * fVar243) *
               auVar183._4_4_ + fVar143;
          auVar162._24_4_ =
               (fVar244 + fVar145 +
               (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                 0.041665796) * fVar244 + 0.16666666) * fVar244 + fVar144) * fVar244 * fVar244) *
               auVar183._8_4_ + fVar145;
          auVar162._28_4_ = auVar27._28_4_ + fVar226 + auVar65._28_4_ + fVar226;
          auVar85 = vrcpps_avx(auVar162);
          fVar288 = auVar85._0_4_;
          fVar289 = auVar85._4_4_;
          fVar290 = auVar85._8_4_;
          fVar291 = auVar85._12_4_;
          fVar292 = auVar85._16_4_;
          fVar293 = auVar85._20_4_;
          fVar95 = auVar85._24_4_;
          auVar27._4_4_ = auVar162._4_4_ * (fVar289 + fVar289);
          auVar27._0_4_ = auVar162._0_4_ * (fVar288 + fVar288);
          auVar27._8_4_ = auVar162._8_4_ * (fVar290 + fVar290);
          auVar27._12_4_ = auVar162._12_4_ * (fVar291 + fVar291);
          auVar27._16_4_ = auVar162._16_4_ * (fVar292 + fVar292);
          auVar27._20_4_ = auVar162._20_4_ * (fVar293 + fVar293);
          auVar27._24_4_ = auVar162._24_4_ * (fVar95 + fVar95);
          auVar27._28_4_ = auVar162._28_4_;
          auVar65._8_4_ = 0x40000000;
          auVar65._0_8_ = 0x4000000040000000;
          auVar65._12_4_ = 0x40000000;
          auVar65._16_4_ = 0x40000000;
          auVar65._20_4_ = 0x40000000;
          auVar65._24_4_ = 0x40000000;
          auVar65._28_4_ = 0x40000000;
          auVar85 = vsubps_avx(auVar65,auVar27);
          auVar160._0_4_ = fVar288 + fVar288 + -1.0 + fVar288 * auVar85._0_4_;
          auVar160._4_4_ = fVar289 + fVar289 + -1.0 + fVar289 * auVar85._4_4_;
          auVar160._8_4_ = fVar290 + fVar290 + -1.0 + fVar290 * auVar85._8_4_;
          auVar160._12_4_ = fVar291 + fVar291 + -1.0 + fVar291 * auVar85._12_4_;
          auVar160._16_4_ = fVar292 + fVar292 + -1.0 + fVar292 * auVar85._16_4_;
          auVar160._20_4_ = fVar293 + fVar293 + -1.0 + fVar293 * auVar85._20_4_;
          auVar160._24_4_ = fVar95 + fVar95 + -1.0 + fVar95 * auVar85._24_4_;
          goto LAB_002e5339;
        case 6:
          fVar288 = **(float **)(&this->field_0xe8 + (long)p_Var20);
          fVar289 = (*(float **)(&this->field_0xe8 + (long)p_Var20))[1];
          auVar168._0_4_ = fVar288 * fVar284 + fVar289;
          auVar168._4_4_ = fVar288 * fVar287 + fVar289;
          auVar168._8_4_ = fVar288 * auVar119._8_4_ + fVar289;
          auVar168._12_4_ = fVar288 * auVar119._12_4_ + fVar289;
          auVar168._16_4_ = fVar288 * auVar119._16_4_ + fVar289;
          auVar168._20_4_ = fVar288 * auVar119._20_4_ + fVar289;
          auVar168._24_4_ = fVar288 * auVar119._24_4_ + fVar289;
          auVar168._28_4_ = fVar288 + fVar289;
          auVar168 = vmaxps_avx(auVar168,_DAT_00557f80);
          auVar85 = vminps_avx(auVar168,auVar85);
          auVar160 = auVar85._0_28_;
LAB_002e5339:
          auVar119._4_4_ = auVar160._4_4_ * fVar287;
          auVar119._0_4_ = auVar160._0_4_ * fVar284;
          auVar119._8_4_ = auVar160._8_4_ * auVar119._8_4_;
          auVar119._12_4_ = auVar160._12_4_ * auVar119._12_4_;
          auVar119._16_4_ = auVar160._16_4_ * auVar119._16_4_;
          auVar119._20_4_ = auVar160._20_4_ * auVar119._20_4_;
          auVar119._24_4_ = auVar160._24_4_ * auVar119._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar41 * 0x20) = auVar119;
        uVar41 = uVar41 + 1;
      } while (uVar41 != uVar40);
    }
    goto LAB_002e5977;
  }
  lVar50 = (long)(int)uVar57;
  if (0 < (int)uVar40 >> 3) {
    local_88 = (ulong)(uint)((int)uVar40 >> 3);
    lVar46 = lVar50 * 0x1c;
    local_90 = lVar50 * 0x20;
    lVar51 = lVar50 * 8;
    lVar49 = lVar50 * 0x18;
    local_100 = lVar50 * 4;
    lVar53 = lVar50 * 0x14;
    local_108 = lVar50 << 4;
    local_110 = lVar50 * 0xc;
    local_118 = 0;
    auVar94 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar225 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar41 = 0;
    do {
      uVar47 = uVar41 * 8;
      fVar288 = 0.0;
      fVar289 = 0.0;
      fVar284 = 0.0;
      fVar287 = 0.0;
      fVar290 = 0.0;
      fVar291 = 0.0;
      fVar292 = 0.0;
      fVar293 = 0.0;
      if (lVar22 != 0) {
        pfVar45 = (float *)(lVar22 + uVar41 * 0x20);
        fVar284 = *pfVar45;
        fVar287 = pfVar45[1];
        fVar288 = pfVar45[2];
        fVar289 = pfVar45[3];
        fVar290 = pfVar45[4];
        fVar291 = pfVar45[5];
        fVar292 = pfVar45[6];
        fVar293 = pfVar45[7];
      }
      pvVar43 = (this->weight_data_tm).data;
      if ((int)uVar57 < 8) {
        uVar54 = 0;
        lVar56 = uVar47 * lVar50 * 4;
        lVar1 = (uVar47 | 1) * lVar50 * 4;
        lVar2 = (uVar47 | 2) * lVar50 * 4;
        lVar3 = (uVar47 | 3) * lVar50 * 4;
        lVar4 = (uVar47 | 4) * lVar50 * 4;
        lVar5 = (uVar47 | 5) * lVar50 * 4;
        lVar6 = (uVar47 | 6) * lVar50 * 4;
        lVar7 = (uVar47 | 7) * lVar50 * 4;
        in_ZMM6 = ZEXT864(0);
        auVar86 = ZEXT832(0);
        auVar122 = ZEXT832(0);
        auVar169 = SUB6432(ZEXT864(0),0);
        auVar234 = ZEXT832(0);
        auVar250 = SUB6432(ZEXT864(0),0);
        auVar261 = ZEXT832(0);
        auVar296 = SUB6432(ZEXT864(0),0);
        pfVar45 = (float *)local_f8._0_8_;
        local_a0 = lVar51;
        local_98 = lVar46;
      }
      else {
        auVar297 = ZEXT864(0);
        iVar38 = 7;
        lVar55 = 0;
        auVar263 = ZEXT864(0);
        auVar251 = ZEXT864(0);
        auVar237 = ZEXT864(0);
        auVar173 = ZEXT864(0);
        auVar138 = ZEXT864(0);
        auVar278 = ZEXT864(0);
        in_ZMM6 = ZEXT864(0);
        do {
          pfVar45 = (float *)(local_f8._0_8_ + lVar55);
          fVar95 = *pfVar45;
          fVar139 = pfVar45[1];
          fVar140 = pfVar45[2];
          fVar141 = pfVar45[3];
          fVar142 = pfVar45[4];
          fVar143 = pfVar45[5];
          fVar144 = pfVar45[6];
          pfVar39 = (float *)((long)pvVar43 + lVar55 + local_118);
          auVar296._0_4_ = fVar95 * *pfVar39 + auVar297._0_4_;
          auVar296._4_4_ = fVar139 * pfVar39[1] + auVar297._4_4_;
          auVar296._8_4_ = fVar140 * pfVar39[2] + auVar297._8_4_;
          auVar296._12_4_ = fVar141 * pfVar39[3] + auVar297._12_4_;
          auVar296._16_4_ = fVar142 * pfVar39[4] + auVar297._16_4_;
          auVar296._20_4_ = fVar143 * pfVar39[5] + auVar297._20_4_;
          auVar296._24_4_ = fVar144 * pfVar39[6] + auVar297._24_4_;
          fVar145 = in_ZMM11._28_4_;
          auVar296._28_4_ = fVar145 + auVar297._28_4_;
          auVar297 = ZEXT3264(auVar296);
          pfVar39 = (float *)((long)pvVar43 + lVar55 + local_100);
          pfVar42 = (float *)((long)pvVar43 + lVar55 + lVar51);
          auVar261._0_4_ = fVar95 * *pfVar39 + auVar263._0_4_;
          auVar261._4_4_ = fVar139 * pfVar39[1] + auVar263._4_4_;
          auVar261._8_4_ = fVar140 * pfVar39[2] + auVar263._8_4_;
          auVar261._12_4_ = fVar141 * pfVar39[3] + auVar263._12_4_;
          auVar261._16_4_ = fVar142 * pfVar39[4] + auVar263._16_4_;
          auVar261._20_4_ = fVar143 * pfVar39[5] + auVar263._20_4_;
          auVar261._24_4_ = fVar144 * pfVar39[6] + auVar263._24_4_;
          auVar261._28_4_ = fVar145 + auVar263._28_4_;
          auVar263 = ZEXT3264(auVar261);
          auVar250._0_4_ = fVar95 * *pfVar42 + auVar251._0_4_;
          auVar250._4_4_ = fVar139 * pfVar42[1] + auVar251._4_4_;
          auVar250._8_4_ = fVar140 * pfVar42[2] + auVar251._8_4_;
          auVar250._12_4_ = fVar141 * pfVar42[3] + auVar251._12_4_;
          auVar250._16_4_ = fVar142 * pfVar42[4] + auVar251._16_4_;
          auVar250._20_4_ = fVar143 * pfVar42[5] + auVar251._20_4_;
          auVar250._24_4_ = fVar144 * pfVar42[6] + auVar251._24_4_;
          fVar226 = in_ZMM12._28_4_;
          auVar250._28_4_ = fVar226 + auVar251._28_4_;
          auVar251 = ZEXT3264(auVar250);
          pfVar39 = (float *)((long)pvVar43 + lVar55 + local_110);
          auVar234._0_4_ = fVar95 * *pfVar39 + auVar237._0_4_;
          auVar234._4_4_ = fVar139 * pfVar39[1] + auVar237._4_4_;
          auVar234._8_4_ = fVar140 * pfVar39[2] + auVar237._8_4_;
          auVar234._12_4_ = fVar141 * pfVar39[3] + auVar237._12_4_;
          auVar234._16_4_ = fVar142 * pfVar39[4] + auVar237._16_4_;
          auVar234._20_4_ = fVar143 * pfVar39[5] + auVar237._20_4_;
          auVar234._24_4_ = fVar144 * pfVar39[6] + auVar237._24_4_;
          auVar234._28_4_ = fVar145 + auVar237._28_4_;
          auVar237 = ZEXT3264(auVar234);
          pfVar39 = (float *)((long)pvVar43 + lVar55 + local_108);
          auVar169._0_4_ = fVar95 * *pfVar39 + auVar173._0_4_;
          auVar169._4_4_ = fVar139 * pfVar39[1] + auVar173._4_4_;
          auVar169._8_4_ = fVar140 * pfVar39[2] + auVar173._8_4_;
          auVar169._12_4_ = fVar141 * pfVar39[3] + auVar173._12_4_;
          auVar169._16_4_ = fVar142 * pfVar39[4] + auVar173._16_4_;
          auVar169._20_4_ = fVar143 * pfVar39[5] + auVar173._20_4_;
          auVar169._24_4_ = fVar144 * pfVar39[6] + auVar173._24_4_;
          auVar169._28_4_ = fVar145 + auVar173._28_4_;
          auVar173 = ZEXT3264(auVar169);
          pfVar39 = (float *)((long)pvVar43 + lVar55 + lVar53);
          in_ZMM11 = ZEXT3264(CONCAT428(fVar145,CONCAT424(fVar144 * pfVar39[6],
                                                          CONCAT420(fVar143 * pfVar39[5],
                                                                    CONCAT416(fVar142 * pfVar39[4],
                                                                              CONCAT412(fVar141 * 
                                                  pfVar39[3],
                                                  CONCAT48(fVar140 * pfVar39[2],
                                                           CONCAT44(fVar139 * pfVar39[1],
                                                                    fVar95 * *pfVar39))))))));
          pfVar42 = (float *)((long)pvVar43 + lVar55 + lVar49);
          in_ZMM12 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar144 * pfVar42[6],
                                                          CONCAT420(fVar143 * pfVar42[5],
                                                                    CONCAT416(fVar142 * pfVar42[4],
                                                                              CONCAT412(fVar141 * 
                                                  pfVar42[3],
                                                  CONCAT48(fVar140 * pfVar42[2],
                                                           CONCAT44(fVar139 * pfVar42[1],
                                                                    fVar95 * *pfVar42))))))));
          auVar122._0_4_ = fVar95 * *pfVar39 + auVar138._0_4_;
          auVar122._4_4_ = fVar139 * pfVar39[1] + auVar138._4_4_;
          auVar122._8_4_ = fVar140 * pfVar39[2] + auVar138._8_4_;
          auVar122._12_4_ = fVar141 * pfVar39[3] + auVar138._12_4_;
          auVar122._16_4_ = fVar142 * pfVar39[4] + auVar138._16_4_;
          auVar122._20_4_ = fVar143 * pfVar39[5] + auVar138._20_4_;
          auVar122._24_4_ = fVar144 * pfVar39[6] + auVar138._24_4_;
          auVar122._28_4_ = fVar145 + auVar138._28_4_;
          auVar138 = ZEXT3264(auVar122);
          auVar86._0_4_ = fVar95 * *pfVar42 + auVar278._0_4_;
          auVar86._4_4_ = fVar139 * pfVar42[1] + auVar278._4_4_;
          auVar86._8_4_ = fVar140 * pfVar42[2] + auVar278._8_4_;
          auVar86._12_4_ = fVar141 * pfVar42[3] + auVar278._12_4_;
          auVar86._16_4_ = fVar142 * pfVar42[4] + auVar278._16_4_;
          auVar86._20_4_ = fVar143 * pfVar42[5] + auVar278._20_4_;
          auVar86._24_4_ = fVar144 * pfVar42[6] + auVar278._24_4_;
          auVar86._28_4_ = fVar226 + auVar278._28_4_;
          auVar278 = ZEXT3264(auVar86);
          pfVar39 = (float *)((long)pvVar43 + lVar55 + lVar46);
          in_ZMM6 = ZEXT3264(CONCAT428(pfVar45[7] + in_ZMM6._28_4_,
                                       CONCAT424(fVar144 * pfVar39[6] + in_ZMM6._24_4_,
                                                 CONCAT420(fVar143 * pfVar39[5] + in_ZMM6._20_4_,
                                                           CONCAT416(fVar142 * pfVar39[4] +
                                                                     in_ZMM6._16_4_,
                                                                     CONCAT412(fVar141 * pfVar39[3]
                                                                               + in_ZMM6._12_4_,
                                                                               CONCAT48(fVar140 * 
                                                  pfVar39[2] + in_ZMM6._8_4_,
                                                  CONCAT44(fVar139 * pfVar39[1] + in_ZMM6._4_4_,
                                                           fVar95 * *pfVar39 + in_ZMM6._0_4_))))))))
          ;
          iVar38 = iVar38 + 8;
          lVar55 = lVar55 + 0x20;
        } while (iVar38 < (int)uVar57);
        lVar7 = lVar55 + lVar46;
        lVar6 = lVar55 + lVar49;
        lVar5 = lVar55 + lVar53;
        lVar4 = lVar55 + local_108;
        lVar3 = lVar55 + local_110;
        lVar2 = lVar55 + lVar51;
        lVar1 = lVar55 + local_100;
        lVar56 = lVar55 + local_118;
        pfVar45 = (float *)(local_f8._0_8_ + lVar55);
        uVar54 = uVar57 & 0xfffffff8;
      }
      if (uVar57 - uVar54 != 0 && (int)uVar54 <= (int)uVar57) {
        lVar55 = 0;
        do {
          auVar183 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar55 * 4 + lVar4)),
                                   ZEXT416(*(uint *)((long)pvVar43 + lVar55 * 4 + lVar5)),0x10);
          auVar183 = vinsertps_avx(auVar183,ZEXT416(*(uint *)((long)pvVar43 + lVar55 * 4 + lVar6)),
                                   0x20);
          auVar183 = vinsertps_avx(auVar183,ZEXT416(*(uint *)((long)pvVar43 + lVar55 * 4 + lVar7)),
                                   0x30);
          auVar227 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar55 * 4 + lVar56)),
                                   ZEXT416(*(uint *)((long)pvVar43 + lVar55 * 4 + lVar1)),0x10);
          auVar227 = vinsertps_avx(auVar227,ZEXT416(*(uint *)((long)pvVar43 + lVar55 * 4 + lVar2)),
                                   0x20);
          auVar227 = vinsertps_avx(auVar227,ZEXT416(*(uint *)((long)pvVar43 + lVar55 * 4 + lVar3)),
                                   0x30);
          fVar95 = pfVar45[lVar55];
          in_ZMM11 = ZEXT3264(CONCAT428(fVar95,CONCAT424(fVar95,CONCAT420(fVar95,CONCAT416(fVar95,
                                                  CONCAT412(fVar95,CONCAT48(fVar95,CONCAT44(fVar95,
                                                  fVar95))))))));
          fVar284 = auVar227._0_4_ * fVar95 + fVar284;
          fVar287 = auVar227._4_4_ * fVar95 + fVar287;
          fVar288 = auVar227._8_4_ * fVar95 + fVar288;
          fVar289 = auVar227._12_4_ * fVar95 + fVar289;
          fVar290 = auVar183._0_4_ * fVar95 + fVar290;
          fVar291 = auVar183._4_4_ * fVar95 + fVar291;
          fVar292 = auVar183._8_4_ * fVar95 + fVar292;
          fVar293 = auVar183._12_4_ + fVar293;
          lVar55 = lVar55 + 1;
        } while (uVar57 - uVar54 != (int)lVar55);
      }
      auVar85 = vhaddps_avx(auVar296,auVar261);
      auVar119 = vhaddps_avx(auVar250,auVar234);
      auVar119 = vhaddps_avx(auVar85,auVar119);
      in_ZMM7 = ZEXT3264(auVar119);
      auVar85 = vhaddps_avx(auVar169,auVar122);
      auVar168 = vhaddps_avx(auVar86,in_ZMM6._0_32_);
      auVar168 = vhaddps_avx(auVar85,auVar168);
      auVar85 = vblendps_avx(auVar119,auVar168,0xf0);
      auVar119 = vperm2f128_avx(auVar119,auVar168,0x21);
      auVar283._0_4_ = fVar284 + auVar119._0_4_ + auVar85._0_4_;
      auVar283._4_4_ = fVar287 + auVar119._4_4_ + auVar85._4_4_;
      auVar283._8_4_ = fVar288 + auVar119._8_4_ + auVar85._8_4_;
      auVar283._12_4_ = fVar289 + auVar119._12_4_ + auVar85._12_4_;
      auVar283._16_4_ = fVar290 + auVar119._16_4_ + auVar85._16_4_;
      auVar283._20_4_ = fVar291 + auVar119._20_4_ + auVar85._20_4_;
      auVar283._24_4_ = fVar292 + auVar119._24_4_ + auVar85._24_4_;
      auVar283._28_4_ = fVar293 + auVar119._28_4_ + auVar85._28_4_;
      auVar168 = auVar225._0_32_;
      auVar119 = auVar94._0_32_;
      fVar284 = auVar94._0_4_;
      fVar287 = auVar94._4_4_;
      fVar288 = auVar94._8_4_;
      fVar289 = auVar94._12_4_;
      fVar290 = auVar94._16_4_;
      fVar291 = auVar94._20_4_;
      fVar292 = auVar94._24_4_;
      fVar293 = auVar94._28_4_;
      switch(uVar19) {
      case 1:
        auVar283 = vmaxps_avx(auVar283,auVar168);
        break;
      case 2:
        auVar24 = vmaxps_avx(auVar283,auVar168);
        auVar85 = vminps_avx(auVar283,auVar168);
        fVar284 = **(float **)(&this->field_0xe8 + (long)p_Var20);
        auVar26._4_4_ = fVar284 * auVar85._4_4_;
        auVar26._0_4_ = fVar284 * auVar85._0_4_;
        auVar26._8_4_ = fVar284 * auVar85._8_4_;
        auVar26._12_4_ = fVar284 * auVar85._12_4_;
        auVar26._16_4_ = fVar284 * auVar85._16_4_;
        auVar26._20_4_ = fVar284 * auVar85._20_4_;
        auVar26._24_4_ = fVar284 * auVar85._24_4_;
        auVar26._28_4_ = auVar85._28_4_;
        goto LAB_002e618a;
      case 3:
        uVar12 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var20);
        auVar89._4_4_ = uVar12;
        auVar89._0_4_ = uVar12;
        auVar89._8_4_ = uVar12;
        auVar89._12_4_ = uVar12;
        auVar89._16_4_ = uVar12;
        auVar89._20_4_ = uVar12;
        auVar89._24_4_ = uVar12;
        auVar89._28_4_ = uVar12;
        uVar12 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var20))[1];
        auVar131._4_4_ = uVar12;
        auVar131._0_4_ = uVar12;
        auVar131._8_4_ = uVar12;
        auVar131._12_4_ = uVar12;
        auVar131._16_4_ = uVar12;
        auVar131._20_4_ = uVar12;
        auVar131._24_4_ = uVar12;
        auVar131._28_4_ = uVar12;
        auVar85 = vmaxps_avx(auVar283,auVar89);
        auVar283 = vminps_avx(auVar85,auVar131);
        break;
      case 4:
        uVar47 = CONCAT44(auVar283._4_4_,auVar283._0_4_);
        auVar90._0_8_ = uVar47 ^ 0x8000000080000000;
        auVar90._8_4_ = -auVar283._8_4_;
        auVar90._12_4_ = -auVar283._12_4_;
        auVar90._16_4_ = -auVar283._16_4_;
        auVar90._20_4_ = -auVar283._20_4_;
        auVar90._24_4_ = -auVar283._24_4_;
        auVar90._28_4_ = -auVar283._28_4_;
        auVar132._8_4_ = 0x42b0c0a5;
        auVar132._0_8_ = 0x42b0c0a542b0c0a5;
        auVar132._12_4_ = 0x42b0c0a5;
        auVar132._16_4_ = 0x42b0c0a5;
        auVar132._20_4_ = 0x42b0c0a5;
        auVar132._24_4_ = 0x42b0c0a5;
        auVar132._28_4_ = 0x42b0c0a5;
        auVar85 = vminps_avx(auVar90,auVar132);
        auVar133._8_4_ = 0xc2b0c0a5;
        auVar133._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar133._12_4_ = 0xc2b0c0a5;
        auVar133._16_4_ = 0xc2b0c0a5;
        auVar133._20_4_ = 0xc2b0c0a5;
        auVar133._24_4_ = 0xc2b0c0a5;
        auVar133._28_4_ = 0xc2b0c0a5;
        auVar168 = vmaxps_avx(auVar85,auVar133);
        auVar134._0_4_ = auVar168._0_4_ * 1.442695 + 0.5;
        auVar134._4_4_ = auVar168._4_4_ * 1.442695 + 0.5;
        auVar134._8_4_ = auVar168._8_4_ * 1.442695 + 0.5;
        auVar134._12_4_ = auVar168._12_4_ * 1.442695 + 0.5;
        auVar134._16_4_ = auVar168._16_4_ * 1.442695 + 0.5;
        auVar134._20_4_ = auVar168._20_4_ * 1.442695 + 0.5;
        auVar134._24_4_ = auVar168._24_4_ * 1.442695 + 0.5;
        auVar134._28_4_ = 0x3ff8aa3b;
        auVar27 = vroundps_avx(auVar134,1);
        auVar85 = vcmpps_avx(auVar134,auVar27,1);
        auVar85 = vandps_avx(auVar85,auVar119);
        auVar85 = vsubps_avx(auVar27,auVar85);
        fVar95 = auVar168._0_4_ + auVar85._0_4_ * -0.6931472;
        fVar139 = auVar168._4_4_ + auVar85._4_4_ * -0.6931472;
        fVar140 = auVar168._8_4_ + auVar85._8_4_ * -0.6931472;
        fVar141 = auVar168._12_4_ + auVar85._12_4_ * -0.6931472;
        fVar142 = auVar168._16_4_ + auVar85._16_4_ * -0.6931472;
        fVar143 = auVar168._20_4_ + auVar85._20_4_ * -0.6931472;
        fVar144 = auVar168._24_4_ + auVar85._24_4_ * -0.6931472;
        in_ZMM7 = ZEXT3264(CONCAT428(0x3c088908,
                                     CONCAT424(0x3c088908,
                                               CONCAT420(0x3c088908,
                                                         CONCAT416(0x3c088908,
                                                                   CONCAT412(0x3c088908,
                                                                             CONCAT48(0x3c088908,
                                                                                                                                                                            
                                                  0x3c0889083c088908)))))));
        fVar145 = ((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                   0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5;
        fVar226 = ((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5;
        fVar238 = ((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5;
        fVar239 = ((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5;
        fVar240 = ((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
                   0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5;
        fVar241 = ((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                   0.041665796) * fVar143 + 0.16666666) * fVar143 + 0.5;
        fVar242 = ((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144 +
                   0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3f37e013,
                                     CONCAT424(fVar242,CONCAT420(fVar241,CONCAT416(fVar240,CONCAT412
                                                  (fVar239,CONCAT48(fVar238,CONCAT44(fVar226,fVar145
                                                                                    ))))))));
        auVar107._0_4_ = (int)auVar85._0_4_;
        auVar107._4_4_ = (int)auVar85._4_4_;
        auVar107._8_4_ = (int)auVar85._8_4_;
        auVar107._12_4_ = (int)auVar85._12_4_;
        auVar135._16_4_ = (int)auVar85._16_4_;
        auVar135._0_16_ = auVar107;
        auVar135._20_4_ = (int)auVar85._20_4_;
        auVar135._24_4_ = (int)auVar85._24_4_;
        auVar135._28_4_ = (int)auVar85._28_4_;
        auVar227 = vpslld_avx(auVar107,0x17);
        auVar183 = vpslld_avx(auVar135._16_16_,0x17);
        auVar59._8_4_ = 0x3f800000;
        auVar59._0_8_ = 0x3f8000003f800000;
        auVar59._12_4_ = 0x3f800000;
        auVar183 = vpaddd_avx(auVar183,auVar59);
        auVar227 = vpaddd_avx(auVar227,auVar59);
        auVar91._0_4_ = (fVar95 + fVar284 + fVar95 * fVar95 * fVar145) * auVar227._0_4_ + fVar284;
        auVar91._4_4_ = (fVar139 + fVar287 + fVar139 * fVar139 * fVar226) * auVar227._4_4_ + fVar287
        ;
        auVar91._8_4_ = (fVar140 + fVar288 + fVar140 * fVar140 * fVar238) * auVar227._8_4_ + fVar288
        ;
        auVar91._12_4_ =
             (fVar141 + fVar289 + fVar141 * fVar141 * fVar239) * auVar227._12_4_ + fVar289;
        auVar91._16_4_ =
             (fVar142 + fVar290 + fVar142 * fVar142 * fVar240) * auVar183._0_4_ + fVar290;
        auVar91._20_4_ =
             (fVar143 + fVar291 + fVar143 * fVar143 * fVar241) * auVar183._4_4_ + fVar291;
        auVar91._24_4_ =
             (fVar144 + fVar292 + fVar144 * fVar144 * fVar242) * auVar183._8_4_ + fVar292;
        auVar91._28_4_ = auVar168._28_4_ + -0.6931472 + fVar293 + -0.6931472 + fVar293;
        auVar26 = vrcpps_avx(auVar91);
        auVar35._4_4_ = auVar91._4_4_ * auVar26._4_4_;
        auVar35._0_4_ = auVar91._0_4_ * auVar26._0_4_;
        auVar35._8_4_ = auVar91._8_4_ * auVar26._8_4_;
        auVar35._12_4_ = auVar91._12_4_ * auVar26._12_4_;
        auVar35._16_4_ = auVar91._16_4_ * auVar26._16_4_;
        auVar35._20_4_ = auVar91._20_4_ * auVar26._20_4_;
        auVar35._24_4_ = auVar91._24_4_ * auVar26._24_4_;
        auVar35._28_4_ = auVar91._28_4_;
        auVar85 = vsubps_avx(auVar119,auVar35);
        auVar24._4_4_ = auVar26._4_4_ * auVar85._4_4_;
        auVar24._0_4_ = auVar26._0_4_ * auVar85._0_4_;
        auVar24._8_4_ = auVar26._8_4_ * auVar85._8_4_;
        auVar24._12_4_ = auVar26._12_4_ * auVar85._12_4_;
        auVar24._16_4_ = auVar26._16_4_ * auVar85._16_4_;
        auVar24._20_4_ = auVar26._20_4_ * auVar85._20_4_;
        auVar24._24_4_ = auVar26._24_4_ * auVar85._24_4_;
        auVar24._28_4_ = auVar85._28_4_;
LAB_002e618a:
        auVar283._0_4_ = auVar26._0_4_ + auVar24._0_4_;
        auVar283._4_4_ = auVar26._4_4_ + auVar24._4_4_;
        auVar283._8_4_ = auVar26._8_4_ + auVar24._8_4_;
        auVar283._12_4_ = auVar26._12_4_ + auVar24._12_4_;
        auVar283._16_4_ = auVar26._16_4_ + auVar24._16_4_;
        auVar283._20_4_ = auVar26._20_4_ + auVar24._20_4_;
        auVar283._24_4_ = auVar26._24_4_ + auVar24._24_4_;
        auVar283._28_4_ = auVar26._28_4_ + auVar24._28_4_;
        break;
      case 5:
        auVar262._8_4_ = 0x42b0c0a5;
        auVar262._0_8_ = 0x42b0c0a542b0c0a5;
        auVar262._12_4_ = 0x42b0c0a5;
        auVar262._16_4_ = 0x42b0c0a5;
        auVar262._20_4_ = 0x42b0c0a5;
        auVar262._24_4_ = 0x42b0c0a5;
        auVar262._28_4_ = 0x42b0c0a5;
        auVar168 = vminps_avx(auVar283,auVar262);
        auVar273._8_4_ = 0xc2b0c0a5;
        auVar273._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar273._12_4_ = 0xc2b0c0a5;
        auVar273._16_4_ = 0xc2b0c0a5;
        auVar273._20_4_ = 0xc2b0c0a5;
        auVar273._24_4_ = 0xc2b0c0a5;
        auVar273._28_4_ = 0xc2b0c0a5;
        auVar168 = vmaxps_avx(auVar273,auVar168);
        in_ZMM11 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar204._8_4_ = 0x3f000000;
        auVar204._0_8_ = 0x3f0000003f000000;
        auVar204._12_4_ = 0x3f000000;
        auVar204._16_4_ = 0x3f000000;
        auVar204._20_4_ = 0x3f000000;
        auVar204._24_4_ = 0x3f000000;
        auVar204._28_4_ = 0x3f000000;
        auVar123._0_4_ = auVar168._0_4_ * 1.442695 + 0.5;
        auVar123._4_4_ = auVar168._4_4_ * 1.442695 + 0.5;
        auVar123._8_4_ = auVar168._8_4_ * 1.442695 + 0.5;
        auVar123._12_4_ = auVar168._12_4_ * 1.442695 + 0.5;
        auVar123._16_4_ = auVar168._16_4_ * 1.442695 + 0.5;
        auVar123._20_4_ = auVar168._20_4_ * 1.442695 + 0.5;
        auVar123._24_4_ = auVar168._24_4_ * 1.442695 + 0.5;
        auVar123._28_4_ = auVar85._28_4_ + 0.5;
        auVar27 = vroundps_avx(auVar123,1);
        auVar85 = vcmpps_avx(auVar123,auVar27,1);
        auVar85 = vandps_avx(auVar85,auVar119);
        auVar85 = vsubps_avx(auVar27,auVar85);
        auVar31._4_4_ = auVar85._4_4_ * 0.6931472;
        auVar31._0_4_ = auVar85._0_4_ * 0.6931472;
        auVar31._8_4_ = auVar85._8_4_ * 0.6931472;
        auVar31._12_4_ = auVar85._12_4_ * 0.6931472;
        auVar31._16_4_ = auVar85._16_4_ * 0.6931472;
        auVar31._20_4_ = auVar85._20_4_ * 0.6931472;
        auVar31._24_4_ = auVar85._24_4_ * 0.6931472;
        auVar31._28_4_ = auVar27._28_4_;
        auVar168 = vsubps_avx(auVar168,auVar31);
        fVar95 = auVar168._0_4_;
        fVar139 = auVar168._4_4_;
        fVar140 = auVar168._8_4_;
        fVar141 = auVar168._12_4_;
        fVar142 = auVar168._16_4_;
        fVar143 = auVar168._20_4_;
        fVar144 = auVar168._24_4_;
        in_ZMM12 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar105._0_4_ = (int)auVar85._0_4_;
        auVar105._4_4_ = (int)auVar85._4_4_;
        auVar105._8_4_ = (int)auVar85._8_4_;
        auVar105._12_4_ = (int)auVar85._12_4_;
        auVar124._16_4_ = (int)auVar85._16_4_;
        auVar124._0_16_ = auVar105;
        auVar124._20_4_ = (int)auVar85._20_4_;
        auVar124._24_4_ = (int)auVar85._24_4_;
        auVar124._28_4_ = (int)auVar85._28_4_;
        auVar227 = vpslld_avx(auVar105,0x17);
        auVar183 = vpslld_avx(auVar124._16_16_,0x17);
        auVar191._8_4_ = 0x3f800000;
        auVar191._0_8_ = 0x3f8000003f800000;
        auVar191._12_4_ = 0x3f800000;
        auVar183 = vpaddd_avx(auVar183,auVar191);
        auVar227 = vpaddd_avx(auVar227,auVar191);
        auVar87._0_4_ =
             (fVar95 + fVar284 +
             fVar95 * fVar95 *
             (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
               0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar227._0_4_ + fVar284;
        auVar87._4_4_ =
             (fVar139 + fVar287 +
             fVar139 * fVar139 *
             (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
               0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar227._4_4_ + fVar287;
        auVar87._8_4_ =
             (fVar140 + fVar288 +
             fVar140 * fVar140 *
             (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
               0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar227._8_4_ + fVar288;
        auVar87._12_4_ =
             (fVar141 + fVar289 +
             fVar141 * fVar141 *
             (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
               0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)) * auVar227._12_4_ + fVar289;
        auVar87._16_4_ =
             (fVar142 + fVar290 +
             fVar142 * fVar142 *
             (((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
               0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5)) * auVar183._0_4_ + fVar290;
        auVar87._20_4_ =
             (fVar143 + fVar291 +
             fVar143 * fVar143 *
             (((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
               0.041665796) * fVar143 + 0.16666666) * fVar143 + 0.5)) * auVar183._4_4_ + fVar291;
        auVar87._24_4_ =
             (fVar144 + fVar292 +
             fVar144 * fVar144 *
             (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144 +
               0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5)) * auVar183._8_4_ + fVar292;
        auVar87._28_4_ = auVar168._28_4_ + fVar293 + auVar27._28_4_ + fVar293;
        auVar125._8_4_ = 0x800000;
        auVar125._0_8_ = 0x80000000800000;
        auVar125._12_4_ = 0x800000;
        auVar125._16_4_ = 0x800000;
        auVar125._20_4_ = 0x800000;
        auVar125._24_4_ = 0x800000;
        auVar125._28_4_ = 0x800000;
        auVar27 = vmaxps_avx(auVar87,auVar125);
        auVar183 = vpsrld_avx(auVar27._16_16_,0x17);
        auVar126._8_4_ = 0x807fffff;
        auVar126._0_8_ = 0x807fffff807fffff;
        auVar126._12_4_ = 0x807fffff;
        auVar126._16_4_ = 0x807fffff;
        auVar126._20_4_ = 0x807fffff;
        auVar126._24_4_ = 0x807fffff;
        auVar126._28_4_ = 0x807fffff;
        auVar85 = vandps_avx(auVar27,auVar126);
        auVar65 = vorps_avx(auVar85,auVar204);
        auVar235._8_4_ = 0x3f3504f3;
        auVar235._0_8_ = 0x3f3504f33f3504f3;
        auVar235._12_4_ = 0x3f3504f3;
        auVar235._16_4_ = 0x3f3504f3;
        auVar235._20_4_ = 0x3f3504f3;
        auVar235._24_4_ = 0x3f3504f3;
        auVar235._28_4_ = 0x3f3504f3;
        auVar168 = vcmpps_avx(auVar235,auVar65,2);
        auVar85 = vandnps_avx(auVar168,auVar65);
        fVar95 = auVar85._0_4_ + auVar65._0_4_ + -1.0;
        fVar139 = auVar85._4_4_ + auVar65._4_4_ + -1.0;
        fVar140 = auVar85._8_4_ + auVar65._8_4_ + -1.0;
        fVar141 = auVar85._12_4_ + auVar65._12_4_ + -1.0;
        fVar142 = auVar85._16_4_ + auVar65._16_4_ + -1.0;
        fVar143 = auVar85._20_4_ + auVar65._20_4_ + -1.0;
        fVar144 = auVar85._24_4_ + auVar65._24_4_ + -1.0;
        auVar183 = vpsubd_avx(auVar183,auVar168._16_16_);
        auVar227 = vpsrld_avx(auVar27._0_16_,0x17);
        auVar246._8_4_ = 0xffffff81;
        auVar246._0_8_ = 0xffffff81ffffff81;
        auVar246._12_4_ = 0xffffff81;
        auVar183 = vpaddd_avx(auVar246,auVar183);
        auVar227 = vpsubd_avx(auVar227,auVar168._0_16_);
        auVar227 = vpaddd_avx(auVar246,auVar227);
        auVar170._16_16_ = auVar183;
        auVar170._0_16_ = auVar227;
        auVar168 = vcmpps_avx(auVar87,_DAT_00557f80,2);
        auVar27 = vcvtdq2ps_avx(auVar170);
        auVar32._4_4_ =
             (auVar27._4_4_ * 0.6931472 + fVar139 +
             fVar139 * fVar139 *
             (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) * fVar139 +
                   -0.12420141) * fVar139 + 0.14249323) * fVar139 + -0.16668057) * fVar139 +
                0.20000714) * fVar139 + -0.24999994) * fVar139 + 0.3333333) * fVar139 + -0.5)) *
             -2.0;
        auVar32._0_4_ =
             (auVar27._0_4_ * 0.6931472 + fVar95 +
             fVar95 * fVar95 *
             (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 + 0.116769984) * fVar95 +
                   -0.12420141) * fVar95 + 0.14249323) * fVar95 + -0.16668057) * fVar95 + 0.20000714
                ) * fVar95 + -0.24999994) * fVar95 + 0.3333333) * fVar95 + -0.5)) * -2.0;
        auVar32._8_4_ =
             (auVar27._8_4_ * 0.6931472 + fVar140 +
             fVar140 * fVar140 *
             (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 + 0.116769984) * fVar140 +
                   -0.12420141) * fVar140 + 0.14249323) * fVar140 + -0.16668057) * fVar140 +
                0.20000714) * fVar140 + -0.24999994) * fVar140 + 0.3333333) * fVar140 + -0.5)) *
             -2.0;
        auVar32._12_4_ =
             (auVar27._12_4_ * 0.6931472 + fVar141 +
             fVar141 * fVar141 *
             (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) * fVar141 +
                   -0.12420141) * fVar141 + 0.14249323) * fVar141 + -0.16668057) * fVar141 +
                0.20000714) * fVar141 + -0.24999994) * fVar141 + 0.3333333) * fVar141 + -0.5)) *
             -2.0;
        auVar32._16_4_ =
             (auVar27._16_4_ * 0.6931472 + fVar142 +
             fVar142 * fVar142 *
             (((((((((fVar142 * 0.070376836 + -0.1151461) * fVar142 + 0.116769984) * fVar142 +
                   -0.12420141) * fVar142 + 0.14249323) * fVar142 + -0.16668057) * fVar142 +
                0.20000714) * fVar142 + -0.24999994) * fVar142 + 0.3333333) * fVar142 + -0.5)) *
             -2.0;
        auVar32._20_4_ =
             (auVar27._20_4_ * 0.6931472 + fVar143 +
             fVar143 * fVar143 *
             (((((((((fVar143 * 0.070376836 + -0.1151461) * fVar143 + 0.116769984) * fVar143 +
                   -0.12420141) * fVar143 + 0.14249323) * fVar143 + -0.16668057) * fVar143 +
                0.20000714) * fVar143 + -0.24999994) * fVar143 + 0.3333333) * fVar143 + -0.5)) *
             -2.0;
        auVar32._24_4_ =
             (auVar27._24_4_ * 0.6931472 + fVar144 +
             fVar144 * fVar144 *
             (((((((((fVar144 * 0.070376836 + -0.1151461) * fVar144 + 0.116769984) * fVar144 +
                   -0.12420141) * fVar144 + 0.14249323) * fVar144 + -0.16668057) * fVar144 +
                0.20000714) * fVar144 + -0.24999994) * fVar144 + 0.3333333) * fVar144 + -0.5)) *
             -2.0;
        auVar32._28_4_ = auVar27._28_4_ + auVar85._28_4_ + auVar65._28_4_ + -1.0 + 0.0;
        auVar171._8_4_ = 0x7fffffff;
        auVar171._0_8_ = 0x7fffffff7fffffff;
        auVar171._12_4_ = 0x7fffffff;
        auVar171._16_4_ = 0x7fffffff;
        auVar171._20_4_ = 0x7fffffff;
        auVar171._24_4_ = 0x7fffffff;
        auVar171._28_4_ = 0x7fffffff;
        auVar85 = vblendvps_avx(auVar32,auVar171,auVar168);
        auVar127._8_4_ = 0x42b0c0a5;
        auVar127._0_8_ = 0x42b0c0a542b0c0a5;
        auVar127._12_4_ = 0x42b0c0a5;
        auVar127._16_4_ = 0x42b0c0a5;
        auVar127._20_4_ = 0x42b0c0a5;
        auVar127._24_4_ = 0x42b0c0a5;
        auVar127._28_4_ = 0x42b0c0a5;
        auVar85 = vminps_avx(auVar85,auVar127);
        auVar128._8_4_ = 0xc2b0c0a5;
        auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar128._12_4_ = 0xc2b0c0a5;
        auVar128._16_4_ = 0xc2b0c0a5;
        auVar128._20_4_ = 0xc2b0c0a5;
        auVar128._24_4_ = 0xc2b0c0a5;
        auVar128._28_4_ = 0xc2b0c0a5;
        auVar168 = vmaxps_avx(auVar85,auVar128);
        auVar129._0_4_ = auVar168._0_4_ * 1.442695 + 0.5;
        auVar129._4_4_ = auVar168._4_4_ * 1.442695 + 0.5;
        auVar129._8_4_ = auVar168._8_4_ * 1.442695 + 0.5;
        auVar129._12_4_ = auVar168._12_4_ * 1.442695 + 0.5;
        auVar129._16_4_ = auVar168._16_4_ * 1.442695 + 0.5;
        auVar129._20_4_ = auVar168._20_4_ * 1.442695 + 0.5;
        auVar129._24_4_ = auVar168._24_4_ * 1.442695 + 0.5;
        auVar129._28_4_ = 0xc2afc0a5;
        auVar27 = vroundps_avx(auVar129,1);
        auVar85 = vcmpps_avx(auVar129,auVar27,1);
        auVar85 = vandps_avx(auVar85,auVar119);
        auVar85 = vsubps_avx(auVar27,auVar85);
        auVar33._4_4_ = auVar85._4_4_ * 0.6931472;
        auVar33._0_4_ = auVar85._0_4_ * 0.6931472;
        auVar33._8_4_ = auVar85._8_4_ * 0.6931472;
        auVar33._12_4_ = auVar85._12_4_ * 0.6931472;
        auVar33._16_4_ = auVar85._16_4_ * 0.6931472;
        auVar33._20_4_ = auVar85._20_4_ * 0.6931472;
        auVar33._24_4_ = auVar85._24_4_ * 0.6931472;
        auVar33._28_4_ = auVar27._28_4_;
        auVar168 = vsubps_avx(auVar168,auVar33);
        fVar95 = auVar168._0_4_;
        fVar139 = auVar168._4_4_;
        fVar140 = auVar168._8_4_;
        fVar141 = auVar168._12_4_;
        fVar142 = auVar168._16_4_;
        fVar143 = auVar168._20_4_;
        fVar144 = auVar168._24_4_;
        auVar225 = ZEXT864(0) << 0x20;
        in_ZMM7 = ZEXT3264(auVar204);
        auVar94 = ZEXT3264(auVar119);
        fVar145 = ((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                   0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5;
        fVar226 = ((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5;
        fVar238 = ((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5;
        fVar239 = ((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5;
        fVar240 = ((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142 +
                   0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5;
        fVar241 = ((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                   0.041665796) * fVar143 + 0.16666666) * fVar143 + 0.5;
        fVar242 = ((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144 +
                   0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3f37d30c,
                                     CONCAT424(fVar242,CONCAT420(fVar241,CONCAT416(fVar240,CONCAT412
                                                  (fVar239,CONCAT48(fVar238,CONCAT44(fVar226,fVar145
                                                                                    ))))))));
        auVar106._0_4_ = (int)auVar85._0_4_;
        auVar106._4_4_ = (int)auVar85._4_4_;
        auVar106._8_4_ = (int)auVar85._8_4_;
        auVar106._12_4_ = (int)auVar85._12_4_;
        auVar130._16_4_ = (int)auVar85._16_4_;
        auVar130._0_16_ = auVar106;
        auVar130._20_4_ = (int)auVar85._20_4_;
        auVar130._24_4_ = (int)auVar85._24_4_;
        auVar130._28_4_ = (int)auVar85._28_4_;
        auVar227 = vpslld_avx(auVar106,0x17);
        auVar183 = vpslld_avx(auVar130._16_16_,0x17);
        auVar183 = vpaddd_avx(auVar183,auVar191);
        auVar227 = vpaddd_avx(auVar227,auVar191);
        auVar88._0_4_ = (fVar95 + fVar284 + fVar95 * fVar95 * fVar145) * auVar227._0_4_ + fVar284;
        auVar88._4_4_ = (fVar139 + fVar287 + fVar139 * fVar139 * fVar226) * auVar227._4_4_ + fVar287
        ;
        auVar88._8_4_ = (fVar140 + fVar288 + fVar140 * fVar140 * fVar238) * auVar227._8_4_ + fVar288
        ;
        auVar88._12_4_ =
             (fVar141 + fVar289 + fVar141 * fVar141 * fVar239) * auVar227._12_4_ + fVar289;
        auVar88._16_4_ =
             (fVar142 + fVar290 + fVar142 * fVar142 * fVar240) * auVar183._0_4_ + fVar290;
        auVar88._20_4_ =
             (fVar143 + fVar291 + fVar143 * fVar143 * fVar241) * auVar183._4_4_ + fVar291;
        auVar88._24_4_ =
             (fVar144 + fVar292 + fVar144 * fVar144 * fVar242) * auVar183._8_4_ + fVar292;
        auVar88._28_4_ = auVar168._28_4_ + fVar293 + auVar27._28_4_ + fVar293;
        auVar85 = vrcpps_avx(auVar88);
        fVar284 = auVar85._0_4_;
        fVar287 = auVar85._4_4_;
        fVar288 = auVar85._8_4_;
        fVar289 = auVar85._12_4_;
        fVar290 = auVar85._16_4_;
        fVar291 = auVar85._20_4_;
        fVar292 = auVar85._24_4_;
        auVar34._4_4_ = auVar88._4_4_ * (fVar287 + fVar287);
        auVar34._0_4_ = auVar88._0_4_ * (fVar284 + fVar284);
        auVar34._8_4_ = auVar88._8_4_ * (fVar288 + fVar288);
        auVar34._12_4_ = auVar88._12_4_ * (fVar289 + fVar289);
        auVar34._16_4_ = auVar88._16_4_ * (fVar290 + fVar290);
        auVar34._20_4_ = auVar88._20_4_ * (fVar291 + fVar291);
        auVar34._24_4_ = auVar88._24_4_ * (fVar292 + fVar292);
        auVar34._28_4_ = auVar88._28_4_;
        auVar66._8_4_ = 0x40000000;
        auVar66._0_8_ = 0x4000000040000000;
        auVar66._12_4_ = 0x40000000;
        auVar66._16_4_ = 0x40000000;
        auVar66._20_4_ = 0x40000000;
        auVar66._24_4_ = 0x40000000;
        auVar66._28_4_ = 0x40000000;
        auVar85 = vsubps_avx(auVar66,auVar34);
        auVar84._0_4_ = fVar284 + fVar284 + -1.0 + fVar284 * auVar85._0_4_;
        auVar84._4_4_ = fVar287 + fVar287 + -1.0 + fVar287 * auVar85._4_4_;
        auVar84._8_4_ = fVar288 + fVar288 + -1.0 + fVar288 * auVar85._8_4_;
        auVar84._12_4_ = fVar289 + fVar289 + -1.0 + fVar289 * auVar85._12_4_;
        auVar84._16_4_ = fVar290 + fVar290 + -1.0 + fVar290 * auVar85._16_4_;
        auVar84._20_4_ = fVar291 + fVar291 + -1.0 + fVar291 * auVar85._20_4_;
        auVar84._24_4_ = fVar292 + fVar292 + -1.0 + fVar292 * auVar85._24_4_;
        goto LAB_002e61b3;
      case 6:
        fVar284 = **(float **)(&this->field_0xe8 + (long)p_Var20);
        fVar287 = (*(float **)(&this->field_0xe8 + (long)p_Var20))[1];
        auVar92._0_4_ = auVar283._0_4_ * fVar284 + fVar287;
        auVar92._4_4_ = auVar283._4_4_ * fVar284 + fVar287;
        auVar92._8_4_ = auVar283._8_4_ * fVar284 + fVar287;
        auVar92._12_4_ = auVar283._12_4_ * fVar284 + fVar287;
        auVar92._16_4_ = auVar283._16_4_ * fVar284 + fVar287;
        auVar92._20_4_ = auVar283._20_4_ * fVar284 + fVar287;
        auVar92._24_4_ = auVar283._24_4_ * fVar284 + fVar287;
        auVar92._28_4_ = fVar284 + fVar287;
        auVar85 = vmaxps_avx(auVar168,auVar92);
        auVar85 = vminps_avx(auVar85,auVar119);
        auVar84 = auVar85._0_28_;
LAB_002e61b3:
        auVar283._4_4_ = auVar283._4_4_ * auVar84._4_4_;
        auVar283._0_4_ = auVar283._0_4_ * auVar84._0_4_;
        auVar283._8_4_ = auVar283._8_4_ * auVar84._8_4_;
        auVar283._12_4_ = auVar283._12_4_ * auVar84._12_4_;
        auVar283._16_4_ = auVar283._16_4_ * auVar84._16_4_;
        auVar283._20_4_ = auVar283._20_4_ * auVar84._20_4_;
        auVar283._24_4_ = auVar283._24_4_ * auVar84._24_4_;
      }
      auVar183 = in_ZMM12._0_16_;
      *(undefined1 (*) [32])((long)top_blob->data + uVar41 * 0x20) = auVar283;
      uVar41 = uVar41 + 1;
      lVar46 = lVar46 + local_90;
      lVar49 = lVar49 + local_90;
      lVar53 = lVar53 + local_90;
      local_108 = local_108 + local_90;
      local_110 = local_110 + local_90;
      lVar51 = lVar51 + local_90;
      local_100 = local_100 + local_90;
      local_118 = local_118 + local_90;
      local_a8 = p_Var20;
      local_80 = (ulong)uVar19;
    } while (uVar41 != local_88);
  }
  uVar41 = (long)(int)uVar40 & 0xfffffffffffffff8;
  if ((uVar40 >> 2 & 1) == 0) goto LAB_002e6903;
  if (lVar22 == 0) {
    fVar284 = 0.0;
    fVar287 = 0.0;
    fVar288 = 0.0;
    fVar289 = 0.0;
  }
  else {
    pfVar45 = (float *)(lVar22 + uVar41 * 4);
    fVar284 = *pfVar45;
    fVar287 = pfVar45[1];
    fVar288 = pfVar45[2];
    fVar289 = pfVar45[3];
  }
  pvVar23 = (this->weight_data_tm).data;
  pvVar43 = (void *)((long)pvVar23 + uVar41 * lVar50 * 4);
  if ((int)uVar57 < 8) {
    uVar54 = 0;
    lVar51 = (uVar41 | 1) * lVar50 * 4;
    lVar49 = (uVar41 | 2) * lVar50 * 4;
    lVar53 = (uVar41 | 3) * lVar50 * 4;
    auVar136 = ZEXT832(0);
    auVar205 = ZEXT832(0);
    auVar172 = ZEXT832(0);
    auVar93 = ZEXT832(0);
    pfVar45 = (float *)local_f8._0_8_;
  }
  else {
    uVar54 = uVar57 & 0xfffffff8;
    lVar51 = (uVar41 + 3) * lVar50;
    lVar49 = (uVar41 + 2) * lVar50;
    lVar46 = (uVar41 + 1) * lVar50;
    auVar94 = ZEXT864(0);
    iVar38 = 7;
    lVar56 = 0;
    auVar278 = ZEXT864(0);
    auVar138 = ZEXT864(0);
    auVar225 = ZEXT864(0);
    do {
      pfVar45 = (float *)(local_f8._0_8_ + lVar56);
      fVar290 = *pfVar45;
      fVar291 = pfVar45[1];
      fVar292 = pfVar45[2];
      fVar293 = pfVar45[3];
      fVar95 = pfVar45[4];
      fVar139 = pfVar45[5];
      fVar140 = pfVar45[6];
      pfVar39 = (float *)((long)pvVar43 + lVar56);
      auVar136._0_4_ = fVar290 * *pfVar39 + auVar225._0_4_;
      auVar136._4_4_ = fVar291 * pfVar39[1] + auVar225._4_4_;
      auVar136._8_4_ = fVar292 * pfVar39[2] + auVar225._8_4_;
      auVar136._12_4_ = fVar293 * pfVar39[3] + auVar225._12_4_;
      auVar136._16_4_ = fVar95 * pfVar39[4] + auVar225._16_4_;
      auVar136._20_4_ = fVar139 * pfVar39[5] + auVar225._20_4_;
      auVar136._24_4_ = fVar140 * pfVar39[6] + auVar225._24_4_;
      fVar141 = in_ZMM6._28_4_;
      auVar136._28_4_ = fVar141 + auVar225._28_4_;
      auVar225 = ZEXT3264(auVar136);
      pfVar39 = (float *)((long)pvVar23 + lVar56 + lVar46 * 4);
      in_ZMM6 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar140 * pfVar39[6],
                                                     CONCAT420(fVar139 * pfVar39[5],
                                                               CONCAT416(fVar95 * pfVar39[4],
                                                                         CONCAT412(fVar293 * pfVar39
                                                  [3],CONCAT48(fVar292 * pfVar39[2],
                                                               CONCAT44(fVar291 * pfVar39[1],
                                                                        fVar290 * *pfVar39))))))));
      pfVar42 = (float *)((long)pvVar23 + lVar56 + lVar49 * 4);
      auVar173._0_4_ = fVar290 * *pfVar42;
      auVar173._4_4_ = fVar291 * pfVar42[1];
      auVar173._8_4_ = fVar292 * pfVar42[2];
      auVar173._12_4_ = fVar293 * pfVar42[3];
      auVar173._16_4_ = fVar95 * pfVar42[4];
      auVar173._20_4_ = fVar139 * pfVar42[5];
      auVar173._28_36_ = in_ZMM7._28_36_;
      auVar173._24_4_ = fVar140 * pfVar42[6];
      auVar205._0_4_ = fVar290 * *pfVar39 + auVar138._0_4_;
      auVar205._4_4_ = fVar291 * pfVar39[1] + auVar138._4_4_;
      auVar205._8_4_ = fVar292 * pfVar39[2] + auVar138._8_4_;
      auVar205._12_4_ = fVar293 * pfVar39[3] + auVar138._12_4_;
      auVar205._16_4_ = fVar95 * pfVar39[4] + auVar138._16_4_;
      auVar205._20_4_ = fVar139 * pfVar39[5] + auVar138._20_4_;
      auVar205._24_4_ = fVar140 * pfVar39[6] + auVar138._24_4_;
      auVar205._28_4_ = fVar141 + auVar138._28_4_;
      auVar138 = ZEXT3264(auVar205);
      auVar172._0_4_ = auVar173._0_4_ + auVar278._0_4_;
      auVar172._4_4_ = auVar173._4_4_ + auVar278._4_4_;
      auVar172._8_4_ = auVar173._8_4_ + auVar278._8_4_;
      auVar172._12_4_ = auVar173._12_4_ + auVar278._12_4_;
      auVar172._16_4_ = auVar173._16_4_ + auVar278._16_4_;
      auVar172._20_4_ = auVar173._20_4_ + auVar278._20_4_;
      auVar172._24_4_ = auVar173._24_4_ + auVar278._24_4_;
      auVar172._28_4_ = in_ZMM7._28_4_ + auVar278._28_4_;
      auVar278 = ZEXT3264(auVar172);
      pfVar39 = (float *)((long)pvVar23 + lVar56 + lVar51 * 4);
      auVar93._0_4_ = fVar290 * *pfVar39 + auVar94._0_4_;
      auVar93._4_4_ = fVar291 * pfVar39[1] + auVar94._4_4_;
      auVar93._8_4_ = fVar292 * pfVar39[2] + auVar94._8_4_;
      auVar93._12_4_ = fVar293 * pfVar39[3] + auVar94._12_4_;
      auVar93._16_4_ = fVar95 * pfVar39[4] + auVar94._16_4_;
      auVar93._20_4_ = fVar139 * pfVar39[5] + auVar94._20_4_;
      auVar93._24_4_ = fVar140 * pfVar39[6] + auVar94._24_4_;
      auVar93._28_4_ = pfVar45[7] + auVar94._28_4_;
      auVar94 = ZEXT3264(auVar93);
      iVar38 = iVar38 + 8;
      lVar56 = lVar56 + 0x20;
      in_ZMM7 = ZEXT3264(auVar173._0_32_);
    } while (iVar38 < (int)uVar57);
    lVar53 = lVar56 + lVar51 * 4;
    lVar49 = lVar56 + lVar49 * 4;
    lVar51 = lVar56 + lVar46 * 4;
    pvVar43 = (void *)((long)pvVar43 + lVar56);
    pfVar45 = (float *)(local_f8._0_8_ + lVar56);
  }
  lVar51 = (long)pvVar23 + lVar51;
  lVar49 = (long)pvVar23 + lVar49;
  lVar53 = (long)pvVar23 + lVar53;
  auVar220 = ZEXT816(0) << 0x40;
  if ((int)(uVar54 | 3) < (int)uVar57) {
    lVar46 = 0;
    auVar94 = ZEXT864(0);
    uVar52 = uVar54;
    auVar227 = ZEXT816(0);
    auVar99 = auVar220;
    auVar187 = ZEXT816(0);
    do {
      pfVar39 = (float *)((long)pfVar45 + lVar46);
      fVar290 = *pfVar39;
      fVar291 = pfVar39[1];
      fVar292 = pfVar39[2];
      fVar293 = pfVar39[3];
      pfVar39 = (float *)((long)pvVar43 + lVar46);
      auVar220._0_4_ = fVar290 * *pfVar39 + auVar99._0_4_;
      auVar220._4_4_ = fVar291 * pfVar39[1] + auVar99._4_4_;
      auVar220._8_4_ = fVar292 * pfVar39[2] + auVar99._8_4_;
      auVar220._12_4_ = fVar293 * pfVar39[3] + auVar99._12_4_;
      pfVar39 = (float *)(lVar51 + lVar46);
      auVar247._0_4_ = fVar290 * *pfVar39 + auVar94._0_4_;
      auVar247._4_4_ = fVar291 * pfVar39[1] + auVar94._4_4_;
      auVar247._8_4_ = fVar292 * pfVar39[2] + auVar94._8_4_;
      auVar247._12_4_ = fVar293 * pfVar39[3] + auVar94._12_4_;
      auVar94 = ZEXT1664(auVar247);
      pfVar39 = (float *)(lVar49 + lVar46);
      auVar232._0_4_ = fVar290 * *pfVar39 + auVar187._0_4_;
      auVar232._4_4_ = fVar291 * pfVar39[1] + auVar187._4_4_;
      auVar232._8_4_ = fVar292 * pfVar39[2] + auVar187._8_4_;
      auVar232._12_4_ = fVar293 * pfVar39[3] + auVar187._12_4_;
      pfVar39 = (float *)(lVar53 + lVar46);
      auVar214._0_4_ = fVar290 * *pfVar39 + auVar227._0_4_;
      auVar214._4_4_ = fVar291 * pfVar39[1] + auVar227._4_4_;
      auVar214._8_4_ = fVar292 * pfVar39[2] + auVar227._8_4_;
      auVar214._12_4_ = fVar293 * pfVar39[3] + auVar227._12_4_;
      uVar54 = uVar52 + 4;
      iVar38 = uVar52 + 7;
      lVar46 = lVar46 + 0x10;
      uVar52 = uVar54;
      auVar227 = auVar214;
      auVar99 = auVar220;
      auVar187 = auVar232;
    } while (iVar38 < (int)uVar57);
    pfVar45 = (float *)((long)pfVar45 + lVar46);
    lVar53 = lVar53 + lVar46;
    lVar49 = lVar49 + lVar46;
    lVar51 = lVar51 + lVar46;
    pvVar43 = (void *)((long)pvVar43 + lVar46);
  }
  else {
    auVar247 = SUB6416(ZEXT864(0),0);
    auVar232 = ZEXT816(0);
    auVar214 = ZEXT816(0);
  }
  if (uVar57 - uVar54 != 0 && (int)uVar54 <= (int)uVar57) {
    lVar46 = 0;
    do {
      auVar227 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar46 * 4)),
                               ZEXT416(*(uint *)(lVar51 + lVar46 * 4)),0x10);
      auVar227 = vinsertps_avx(auVar227,ZEXT416(*(uint *)(lVar49 + lVar46 * 4)),0x20);
      auVar227 = vinsertps_avx(auVar227,ZEXT416(*(uint *)(lVar53 + lVar46 * 4)),0x30);
      fVar290 = pfVar45[lVar46];
      fVar284 = auVar227._0_4_ * fVar290 + fVar284;
      fVar287 = auVar227._4_4_ * fVar290 + fVar287;
      fVar288 = auVar227._8_4_ * fVar290 + fVar288;
      fVar289 = auVar227._12_4_ * fVar290 + fVar289;
      lVar46 = lVar46 + 1;
    } while (uVar57 - uVar54 != (int)lVar46);
  }
  auVar85 = vhaddps_avx(auVar136,auVar205);
  auVar119 = vhaddps_avx(auVar172,auVar93);
  auVar85 = vhaddps_avx(auVar85,auVar119);
  auVar99 = vunpcklps_avx(auVar220,auVar247);
  auVar187 = vunpcklps_avx(auVar232,auVar214);
  auVar97 = vunpckhps_avx(auVar220,auVar247);
  auVar98 = vunpckhps_avx(auVar232,auVar214);
  auVar227 = vmovlhps_avx(auVar99,auVar187);
  auVar187 = vunpckhpd_avx(auVar99,auVar187);
  auVar99 = vmovlhps_avx(auVar97,auVar98);
  auVar97 = vunpckhpd_avx(auVar97,auVar98);
  auVar60._0_4_ =
       auVar187._0_4_ + auVar227._0_4_ + auVar99._0_4_ + auVar97._0_4_ + auVar85._0_4_ +
       auVar85._16_4_ + fVar284;
  auVar60._4_4_ =
       auVar187._4_4_ + auVar227._4_4_ + auVar99._4_4_ + auVar97._4_4_ + auVar85._4_4_ +
       auVar85._20_4_ + fVar287;
  auVar60._8_4_ =
       auVar187._8_4_ + auVar227._8_4_ + auVar99._8_4_ + auVar97._8_4_ + auVar85._8_4_ +
       auVar85._24_4_ + fVar288;
  auVar60._12_4_ =
       auVar187._12_4_ + auVar227._12_4_ + auVar99._12_4_ + auVar97._12_4_ + auVar85._12_4_ +
       auVar85._28_4_ + fVar289;
  switch(uVar19) {
  case 1:
    auVar36._12_4_ = 0;
    auVar36._0_12_ = ZEXT412(0);
    auVar60 = vmaxps_avx(auVar60,auVar36 << 0x20);
    break;
  case 2:
    auVar227 = vmaxps_avx(auVar60,ZEXT416(0) << 0x20);
    auVar99 = vminps_avx(auVar60,ZEXT416(0) << 0x20);
    fVar284 = **(float **)(&this->field_0xe8 + (long)p_Var20);
    auVar60._0_4_ = fVar284 * auVar99._0_4_ + auVar227._0_4_;
    auVar60._4_4_ = fVar284 * auVar99._4_4_ + auVar227._4_4_;
    auVar60._8_4_ = fVar284 * auVar99._8_4_ + auVar227._8_4_;
    auVar60._12_4_ = fVar284 * auVar99._12_4_ + auVar227._12_4_;
    break;
  case 3:
    uVar12 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var20);
    auVar77._4_4_ = uVar12;
    auVar77._0_4_ = uVar12;
    auVar77._8_4_ = uVar12;
    auVar77._12_4_ = uVar12;
    uVar12 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var20))[1];
    auVar114._4_4_ = uVar12;
    auVar114._0_4_ = uVar12;
    auVar114._8_4_ = uVar12;
    auVar114._12_4_ = uVar12;
    auVar227 = vmaxps_avx(auVar60,auVar77);
    auVar60 = vminps_avx(auVar227,auVar114);
    break;
  case 4:
    uVar47 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
    auVar61._0_8_ = uVar47 ^ 0x8000000080000000;
    auVar61._8_4_ = -auVar60._8_4_;
    auVar61._12_4_ = -auVar60._12_4_;
    auVar78._8_4_ = 0x42b0c0a5;
    auVar78._0_8_ = 0x42b0c0a542b0c0a5;
    auVar78._12_4_ = 0x42b0c0a5;
    auVar227 = vminps_avx(auVar61,auVar78);
    auVar79._8_4_ = 0xc2b0c0a5;
    auVar79._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar79._12_4_ = 0xc2b0c0a5;
    auVar187 = vmaxps_avx(auVar227,auVar79);
    auVar80._0_4_ = auVar187._0_4_ * 1.442695 + 0.5;
    auVar80._4_4_ = auVar187._4_4_ * 1.442695 + 0.5;
    auVar80._8_4_ = auVar187._8_4_ * 1.442695 + 0.5;
    auVar80._12_4_ = auVar187._12_4_ * 1.442695 + 0.5;
    auVar158._0_4_ = (int)auVar80._0_4_;
    auVar158._4_4_ = (int)auVar80._4_4_;
    auVar158._8_4_ = (int)auVar80._8_4_;
    auVar158._12_4_ = (int)auVar80._12_4_;
    auVar99 = vcvtdq2ps_avx(auVar158);
    auVar227 = vcmpps_avx(auVar80,auVar99,1);
    auVar194._8_4_ = 0x3f800000;
    auVar194._0_8_ = 0x3f8000003f800000;
    auVar194._12_4_ = 0x3f800000;
    auVar227 = vandps_avx(auVar227,auVar194);
    auVar227 = vsubps_avx(auVar99,auVar227);
    fVar284 = auVar187._0_4_ + auVar227._0_4_ * -0.6931472;
    fVar287 = auVar187._4_4_ + auVar227._4_4_ * -0.6931472;
    fVar288 = auVar187._8_4_ + auVar227._8_4_ * -0.6931472;
    fVar289 = auVar187._12_4_ + auVar227._12_4_ * -0.6931472;
    auVar81._0_4_ = (int)auVar227._0_4_;
    auVar81._4_4_ = (int)auVar227._4_4_;
    auVar81._8_4_ = (int)auVar227._8_4_;
    auVar81._12_4_ = (int)auVar227._12_4_;
    auVar227 = vpslld_avx(auVar81,0x17);
    auVar227 = vpaddd_avx(auVar227,auVar194);
    auVar62._0_4_ =
         (fVar284 + 1.0 +
         fVar284 * fVar284 *
         (((((fVar284 * 0.00019875691 + 0.0013981999) * fVar284 + 0.008333452) * fVar284 +
           0.041665796) * fVar284 + 0.16666666) * fVar284 + 0.5)) * auVar227._0_4_ + 1.0;
    auVar62._4_4_ =
         (fVar287 + 1.0 +
         fVar287 * fVar287 *
         (((((fVar287 * 0.00019875691 + 0.0013981999) * fVar287 + 0.008333452) * fVar287 +
           0.041665796) * fVar287 + 0.16666666) * fVar287 + 0.5)) * auVar227._4_4_ + 1.0;
    auVar62._8_4_ =
         (fVar288 + 1.0 +
         fVar288 * fVar288 *
         (((((fVar288 * 0.00019875691 + 0.0013981999) * fVar288 + 0.008333452) * fVar288 +
           0.041665796) * fVar288 + 0.16666666) * fVar288 + 0.5)) * auVar227._8_4_ + 1.0;
    auVar62._12_4_ =
         (fVar289 + 1.0 +
         fVar289 * fVar289 *
         (((((fVar289 * 0.00019875691 + 0.0013981999) * fVar289 + 0.008333452) * fVar289 +
           0.041665796) * fVar289 + 0.16666666) * fVar289 + 0.5)) * auVar227._12_4_ + 1.0;
    auVar227 = vrcpps_avx(auVar62);
    fVar284 = auVar227._0_4_;
    auVar63._0_4_ = auVar62._0_4_ * fVar284;
    fVar287 = auVar227._4_4_;
    auVar63._4_4_ = auVar62._4_4_ * fVar287;
    fVar288 = auVar227._8_4_;
    auVar63._8_4_ = auVar62._8_4_ * fVar288;
    fVar289 = auVar227._12_4_;
    auVar63._12_4_ = auVar62._12_4_ * fVar289;
    auVar227 = vsubps_avx(auVar194,auVar63);
    auVar60._0_4_ = fVar284 + fVar284 * auVar227._0_4_;
    auVar60._4_4_ = fVar287 + fVar287 * auVar227._4_4_;
    auVar60._8_4_ = fVar288 + fVar288 * auVar227._8_4_;
    auVar60._12_4_ = fVar289 + fVar289 * auVar227._12_4_;
    break;
  case 5:
    auVar70._8_4_ = 0x42b0c0a5;
    auVar70._0_8_ = 0x42b0c0a542b0c0a5;
    auVar70._12_4_ = 0x42b0c0a5;
    auVar183 = vminps_avx(auVar60,auVar70);
    auVar108._8_4_ = 0xc2b0c0a5;
    auVar108._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar108._12_4_ = 0xc2b0c0a5;
    auVar99 = vmaxps_avx(auVar183,auVar108);
    auVar192._8_4_ = 0x3f000000;
    auVar192._0_8_ = 0x3f0000003f000000;
    auVar192._12_4_ = 0x3f000000;
    auVar71._0_4_ = auVar99._0_4_ * 1.442695 + 0.5;
    auVar71._4_4_ = auVar99._4_4_ * 1.442695 + 0.5;
    auVar71._8_4_ = auVar99._8_4_ * 1.442695 + 0.5;
    auVar71._12_4_ = auVar99._12_4_ * 1.442695 + 0.5;
    auVar221._0_4_ = (int)auVar71._0_4_;
    auVar221._4_4_ = (int)auVar71._4_4_;
    auVar221._8_4_ = (int)auVar71._8_4_;
    auVar221._12_4_ = (int)auVar71._12_4_;
    auVar227 = vcvtdq2ps_avx(auVar221);
    auVar183 = vcmpps_avx(auVar71,auVar227,1);
    auVar157._8_4_ = 0x3f800000;
    auVar157._0_8_ = 0x3f8000003f800000;
    auVar157._12_4_ = 0x3f800000;
    auVar183 = vandps_avx(auVar183,auVar157);
    auVar183 = vsubps_avx(auVar227,auVar183);
    auVar248._0_4_ = auVar183._0_4_ * 0.6931472;
    auVar248._4_4_ = auVar183._4_4_ * 0.6931472;
    auVar248._8_4_ = auVar183._8_4_ * 0.6931472;
    auVar248._12_4_ = auVar183._12_4_ * 0.6931472;
    auVar227 = vsubps_avx(auVar99,auVar248);
    fVar284 = auVar227._0_4_;
    fVar287 = auVar227._4_4_;
    fVar288 = auVar227._8_4_;
    fVar289 = auVar227._12_4_;
    auVar282._0_4_ = (int)auVar183._0_4_;
    auVar282._4_4_ = (int)auVar183._4_4_;
    auVar282._8_4_ = (int)auVar183._8_4_;
    auVar282._12_4_ = (int)auVar183._12_4_;
    auVar183 = vpslld_avx(auVar282,0x17);
    auVar183 = vpaddd_avx(auVar183,auVar157);
    auVar72._0_4_ =
         auVar183._0_4_ *
         (fVar284 + 1.0 +
         fVar284 * fVar284 *
         (fVar284 * ((((fVar284 * 0.00019875691 + 0.0013981999) * fVar284 + 0.008333452) * fVar284 +
                     0.041665796) * fVar284 + 0.16666666) + 0.5)) + 1.0;
    auVar72._4_4_ =
         auVar183._4_4_ *
         (fVar287 + 1.0 +
         fVar287 * fVar287 *
         (fVar287 * ((((fVar287 * 0.00019875691 + 0.0013981999) * fVar287 + 0.008333452) * fVar287 +
                     0.041665796) * fVar287 + 0.16666666) + 0.5)) + 1.0;
    auVar72._8_4_ =
         auVar183._8_4_ *
         (fVar288 + 1.0 +
         fVar288 * fVar288 *
         (fVar288 * ((((fVar288 * 0.00019875691 + 0.0013981999) * fVar288 + 0.008333452) * fVar288 +
                     0.041665796) * fVar288 + 0.16666666) + 0.5)) + 1.0;
    auVar72._12_4_ =
         auVar183._12_4_ *
         (fVar289 + 1.0 +
         fVar289 * fVar289 *
         (fVar289 * ((((fVar289 * 0.00019875691 + 0.0013981999) * fVar289 + 0.008333452) * fVar289 +
                     0.041665796) * fVar289 + 0.16666666) + 0.5)) + 1.0;
    auVar99 = vcmpps_avx(auVar72,ZEXT816(0) << 0x40,2);
    auVar279._8_4_ = 0x800000;
    auVar279._0_8_ = 0x80000000800000;
    auVar279._12_4_ = 0x800000;
    auVar183 = vmaxps_avx(auVar279,auVar72);
    auVar227 = vpsrld_avx(auVar183,0x17);
    auVar285._8_4_ = 0x807fffff;
    auVar285._0_8_ = 0x807fffff807fffff;
    auVar285._12_4_ = 0x807fffff;
    auVar183 = vandps_avx(auVar285,auVar183);
    auVar97 = vorps_avx(auVar183,auVar192);
    auVar286._8_4_ = 0xffffff82;
    auVar286._0_8_ = 0xffffff82ffffff82;
    auVar286._12_4_ = 0xffffff82;
    auVar98 = vpaddd_avx(auVar227,auVar286);
    auVar280._8_4_ = 0x3f3504f3;
    auVar280._0_8_ = 0x3f3504f33f3504f3;
    auVar280._12_4_ = 0x3f3504f3;
    auVar187 = vcmpps_avx(auVar97,auVar280,1);
    auVar227 = vandps_avx(auVar187,auVar97);
    auVar183._8_4_ = 0xbf800000;
    auVar183._0_8_ = 0xbf800000bf800000;
    auVar183._12_4_ = 0xbf800000;
    fVar284 = auVar227._0_4_ + auVar97._0_4_ + -1.0;
    fVar287 = auVar227._4_4_ + auVar97._4_4_ + -1.0;
    fVar288 = auVar227._8_4_ + auVar97._8_4_ + -1.0;
    fVar289 = auVar227._12_4_ + auVar97._12_4_ + -1.0;
    auVar97 = vcvtdq2ps_avx(auVar98);
    auVar227 = vandps_avx(auVar187,auVar157);
    auVar227 = vsubps_avx(auVar97,auVar227);
    auVar73._0_4_ =
         (fVar284 + auVar227._0_4_ * 0.6931472 +
         fVar284 * fVar284 *
         (fVar284 * (fVar284 * (fVar284 * (fVar284 * (fVar284 * (fVar284 * (fVar284 * (fVar284 * (
                                                  fVar284 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar73._4_4_ =
         (fVar287 + auVar227._4_4_ * 0.6931472 +
         fVar287 * fVar287 *
         (fVar287 * (fVar287 * (fVar287 * (fVar287 * (fVar287 * (fVar287 * (fVar287 * (fVar287 * (
                                                  fVar287 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar73._8_4_ =
         (fVar288 + auVar227._8_4_ * 0.6931472 +
         fVar288 * fVar288 *
         (fVar288 * (fVar288 * (fVar288 * (fVar288 * (fVar288 * (fVar288 * (fVar288 * (fVar288 * (
                                                  fVar288 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar73._12_4_ =
         (fVar289 + auVar227._12_4_ * 0.6931472 +
         fVar289 * fVar289 *
         (fVar289 * (fVar289 * (fVar289 * (fVar289 * (fVar289 * (fVar289 * (fVar289 * (fVar289 * (
                                                  fVar289 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar109._8_4_ = 0x7fffffff;
    auVar109._0_8_ = 0x7fffffff7fffffff;
    auVar109._12_4_ = 0x7fffffff;
    auVar227 = vblendvps_avx(auVar73,auVar109,auVar99);
    auVar110._8_4_ = 0x42b0c0a5;
    auVar110._0_8_ = 0x42b0c0a542b0c0a5;
    auVar110._12_4_ = 0x42b0c0a5;
    auVar227 = vminps_avx(auVar227,auVar110);
    auVar111._8_4_ = 0xc2b0c0a5;
    auVar111._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar111._12_4_ = 0xc2b0c0a5;
    auVar187 = vmaxps_avx(auVar227,auVar111);
    auVar112._0_4_ = auVar187._0_4_ * 1.442695 + 0.5;
    auVar112._4_4_ = auVar187._4_4_ * 1.442695 + 0.5;
    auVar112._8_4_ = auVar187._8_4_ * 1.442695 + 0.5;
    auVar112._12_4_ = auVar187._12_4_ * 1.442695 + 0.5;
    auVar215._0_4_ = (int)auVar112._0_4_;
    auVar215._4_4_ = (int)auVar112._4_4_;
    auVar215._8_4_ = (int)auVar112._8_4_;
    auVar215._12_4_ = (int)auVar112._12_4_;
    auVar99 = vcvtdq2ps_avx(auVar215);
    auVar227 = vcmpps_avx(auVar112,auVar99,1);
    auVar227 = vandps_avx(auVar227,auVar157);
    auVar227 = vsubps_avx(auVar99,auVar227);
    auVar216._0_4_ = auVar227._0_4_ * 0.6931472;
    auVar216._4_4_ = auVar227._4_4_ * 0.6931472;
    auVar216._8_4_ = auVar227._8_4_ * 0.6931472;
    auVar216._12_4_ = auVar227._12_4_ * 0.6931472;
    auVar99 = vsubps_avx(auVar187,auVar216);
    fVar284 = auVar99._0_4_;
    fVar287 = auVar99._4_4_;
    fVar288 = auVar99._8_4_;
    fVar289 = auVar99._12_4_;
    auVar113._0_4_ = (int)auVar227._0_4_;
    auVar113._4_4_ = (int)auVar227._4_4_;
    auVar113._8_4_ = (int)auVar227._8_4_;
    auVar113._12_4_ = (int)auVar227._12_4_;
    auVar227 = vpslld_avx(auVar113,0x17);
    auVar227 = vpaddd_avx(auVar227,auVar157);
    auVar74._0_4_ =
         (fVar284 + 1.0 +
         fVar284 * fVar284 *
         (((((fVar284 * 0.00019875691 + 0.0013981999) * fVar284 + 0.008333452) * fVar284 +
           0.041665796) * fVar284 + 0.16666666) * fVar284 + 0.5)) * auVar227._0_4_ + 1.0;
    auVar74._4_4_ =
         (fVar287 + 1.0 +
         fVar287 * fVar287 *
         (((((fVar287 * 0.00019875691 + 0.0013981999) * fVar287 + 0.008333452) * fVar287 +
           0.041665796) * fVar287 + 0.16666666) * fVar287 + 0.5)) * auVar227._4_4_ + 1.0;
    auVar74._8_4_ =
         (fVar288 + 1.0 +
         fVar288 * fVar288 *
         (((((fVar288 * 0.00019875691 + 0.0013981999) * fVar288 + 0.008333452) * fVar288 +
           0.041665796) * fVar288 + 0.16666666) * fVar288 + 0.5)) * auVar227._8_4_ + 1.0;
    auVar74._12_4_ =
         (fVar289 + 1.0 +
         fVar289 * fVar289 *
         (((((fVar289 * 0.00019875691 + 0.0013981999) * fVar289 + 0.008333452) * fVar289 +
           0.041665796) * fVar289 + 0.16666666) * fVar289 + 0.5)) * auVar227._12_4_ + 1.0;
    auVar227 = vrcpps_avx(auVar74);
    fVar284 = auVar227._0_4_;
    fVar287 = auVar227._4_4_;
    fVar288 = auVar227._8_4_;
    fVar289 = auVar227._12_4_;
    auVar75._0_4_ = auVar74._0_4_ * (fVar284 + fVar284);
    auVar75._4_4_ = auVar74._4_4_ * (fVar287 + fVar287);
    auVar75._8_4_ = auVar74._8_4_ * (fVar288 + fVar288);
    auVar75._12_4_ = auVar74._12_4_ * (fVar289 + fVar289);
    auVar193._8_4_ = 0x40000000;
    auVar193._0_8_ = 0x4000000040000000;
    auVar193._12_4_ = 0x40000000;
    auVar227 = vsubps_avx(auVar193,auVar75);
    auVar76._0_4_ = fVar284 + fVar284 + -1.0 + fVar284 * auVar227._0_4_;
    auVar76._4_4_ = fVar287 + fVar287 + -1.0 + fVar287 * auVar227._4_4_;
    auVar76._8_4_ = fVar288 + fVar288 + -1.0 + fVar288 * auVar227._8_4_;
    auVar76._12_4_ = fVar289 + fVar289 + -1.0 + fVar289 * auVar227._12_4_;
    goto LAB_002e68e6;
  case 6:
    fVar284 = **(float **)(&this->field_0xe8 + (long)p_Var20);
    fVar287 = (*(float **)(&this->field_0xe8 + (long)p_Var20))[1];
    auVar82._0_4_ = fVar284 * auVar60._0_4_ + fVar287;
    auVar82._4_4_ = fVar284 * auVar60._4_4_ + fVar287;
    auVar82._8_4_ = fVar284 * auVar60._8_4_ + fVar287;
    auVar82._12_4_ = fVar284 * auVar60._12_4_ + fVar287;
    auVar227 = vmaxps_avx(auVar82,ZEXT416(0) << 0x20);
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = 0x3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar76 = vminps_avx(auVar227,auVar115);
LAB_002e68e6:
    auVar60._0_4_ = auVar76._0_4_ * auVar60._0_4_;
    auVar60._4_4_ = auVar76._4_4_ * auVar60._4_4_;
    auVar60._8_4_ = auVar76._8_4_ * auVar60._8_4_;
    auVar60._12_4_ = auVar76._12_4_ * auVar60._12_4_;
  }
  *(undefined1 (*) [16])((long)top_blob->data + uVar41 * 4) = auVar60;
LAB_002e6903:
  iVar38 = 0;
  iVar44 = (int)uVar41 + (uVar40 >> 2 & 1) * 4;
  if (iVar44 < (int)uVar40) {
    pvVar43 = (this->weight_data_tm).data;
    pfVar45 = *(float **)(&this->field_0xe8 + (long)p_Var20);
    pvVar23 = top_blob->data;
    local_160 = uVar57 & 0xfffffff8;
    uVar41 = (ulong)iVar44;
    auVar225 = ZEXT3264(_DAT_00555ec0);
    auVar278 = ZEXT3264(_DAT_00555ee0);
    auVar295._8_8_ = 0x8000000000000000;
    auVar295._0_8_ = 0x8000000000000000;
    auVar183 = vpcmpeqd_avx(auVar183,auVar183);
    auVar94 = ZEXT1664(auVar183);
    do {
      auVar183 = ZEXT816(0) << 0x40;
      if (lVar22 != 0) {
        auVar183 = ZEXT416(*(uint *)(lVar22 + uVar41 * 4));
      }
      pfVar39 = (float *)((long)pvVar43 + uVar41 * lVar50 * 4);
      pfVar42 = (float *)uVar37;
      if ((int)uVar57 < 8) {
        fVar284 = 0.0;
        fVar287 = 0.0;
        fVar288 = 0.0;
        fVar289 = 0.0;
        fVar290 = 0.0;
        fVar291 = 0.0;
        fVar292 = 0.0;
        fVar293 = 0.0;
        uVar54 = 0;
      }
      else {
        fVar284 = 0.0;
        fVar287 = 0.0;
        fVar288 = 0.0;
        fVar289 = 0.0;
        fVar290 = 0.0;
        fVar291 = 0.0;
        fVar292 = 0.0;
        fVar293 = 0.0;
        iVar38 = 7;
        do {
          fVar284 = *pfVar39 * *pfVar42 + fVar284;
          fVar287 = pfVar39[1] * pfVar42[1] + fVar287;
          fVar288 = pfVar39[2] * pfVar42[2] + fVar288;
          fVar289 = pfVar39[3] * pfVar42[3] + fVar289;
          fVar290 = pfVar39[4] * pfVar42[4] + fVar290;
          fVar291 = pfVar39[5] * pfVar42[5] + fVar291;
          fVar292 = pfVar39[6] * pfVar42[6] + fVar292;
          fVar293 = pfVar39[7] + fVar293;
          pfVar42 = pfVar42 + 8;
          pfVar39 = pfVar39 + 8;
          iVar38 = iVar38 + 8;
          uVar54 = local_160;
        } while (iVar38 < (int)uVar57);
      }
      fVar95 = 0.0;
      fVar139 = 0.0;
      fVar140 = 0.0;
      fVar141 = 0.0;
      uVar52 = uVar54 | 3;
      while ((int)uVar52 < (int)uVar57) {
        fVar95 = *pfVar39 * *pfVar42 + fVar95;
        fVar139 = pfVar39[1] * pfVar42[1] + fVar139;
        fVar140 = pfVar39[2] * pfVar42[2] + fVar140;
        fVar141 = pfVar39[3] * pfVar42[3] + fVar141;
        pfVar42 = pfVar42 + 4;
        pfVar39 = pfVar39 + 4;
        uVar52 = uVar54 + 7;
        uVar54 = uVar54 + 4;
      }
      if ((int)uVar54 < (int)uVar57) {
        uVar47 = CONCAT44(0,~uVar54 + uVar57);
        auVar183 = vblendps_avx(auVar183,_DAT_00553040,0xe);
        auVar159._8_8_ = 0;
        auVar159._0_8_ = uVar47;
        auVar187 = vpshufd_avx(auVar159,0x44);
        auVar227 = vorps_avx(auVar295,auVar187);
        auVar99 = vorps_avx(auVar295,auVar187);
        uVar48 = 0;
        auVar138 = ZEXT1664(auVar183);
        do {
          auVar173 = auVar138;
          auVar217._8_8_ = 0;
          auVar217._0_8_ = uVar48;
          auVar183 = vpshufd_avx(auVar217,0x44);
          auVar236._16_16_ = auVar183;
          auVar236._0_16_ = auVar183;
          auVar85 = vorps_avx(auVar225._0_32_,auVar236);
          auVar119 = vorps_avx(auVar278._0_32_,auVar236);
          auVar183 = vorps_avx(auVar187,auVar295);
          auVar249._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
          auVar249._8_4_ = auVar119._24_4_;
          auVar249._12_4_ = auVar119._28_4_ ^ 0x80000000;
          auVar98 = vpcmpgtq_avx(auVar249,auVar183);
          auVar272._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar272._8_4_ = auVar119._8_4_;
          auVar272._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar97 = vpcmpgtq_avx(auVar272,auVar227);
          auVar97 = vpackssdw_avx(auVar97,auVar98);
          auVar274._0_8_ = auVar85._16_8_ ^ 0x8000000000000000;
          auVar274._8_4_ = auVar85._24_4_;
          auVar274._12_4_ = auVar85._28_4_ ^ 0x80000000;
          auVar96 = vpcmpgtq_avx(auVar274,auVar183);
          auVar275._0_8_ = auVar85._0_8_ ^ 0x8000000000000000;
          auVar275._8_4_ = auVar85._8_4_;
          auVar275._12_4_ = auVar85._12_4_ ^ 0x80000000;
          auVar183 = vpcmpgtq_avx(auVar275,auVar99);
          auVar183 = vpackssdw_avx(auVar183,auVar96);
          auVar183 = vpackssdw_avx(auVar183 ^ auVar94._0_16_,auVar97 ^ auVar94._0_16_);
          auVar97 = vpmovsxwd_avx(auVar183);
          auVar183 = vpunpckhwd_avx(auVar183,auVar183);
          auVar277._16_16_ = auVar183;
          auVar277._0_16_ = auVar97;
          auVar168 = vmaskmovps_avx(auVar277,*(undefined1 (*) [32])(pfVar42 + uVar48));
          auVar27 = vmaskmovps_avx(auVar277,*(undefined1 (*) [32])(pfVar39 + uVar48));
          auVar183 = vpcmpeqd_avx(auVar168._0_16_,auVar168._0_16_);
          auVar94 = ZEXT1664(auVar183);
          auVar116._0_4_ = auVar173._0_4_ + auVar168._0_4_ * auVar27._0_4_;
          auVar116._4_4_ = auVar173._4_4_ + auVar168._4_4_ * auVar27._4_4_;
          auVar116._8_4_ = auVar173._8_4_ + auVar168._8_4_ * auVar27._8_4_;
          auVar116._12_4_ = auVar173._12_4_ + auVar168._12_4_ * auVar27._12_4_;
          auVar137._16_4_ = auVar173._16_4_ + auVar168._16_4_ * auVar27._16_4_;
          auVar137._0_16_ = auVar116;
          auVar137._20_4_ = auVar173._20_4_ + auVar168._20_4_ * auVar27._20_4_;
          auVar137._24_4_ = auVar173._24_4_ + auVar168._24_4_ * auVar27._24_4_;
          auVar137._28_4_ = auVar173._28_4_ + auVar27._28_4_;
          uVar48 = uVar48 + 8;
          auVar138 = ZEXT3264(auVar137);
        } while ((uVar47 + 8 & 0xfffffffffffffff8) != uVar48);
        auVar227 = vorps_avx(auVar295,auVar187);
        auVar222._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
        auVar222._8_4_ = auVar119._8_4_;
        auVar222._12_4_ = auVar119._12_4_ ^ 0x80000000;
        auVar227 = vpcmpgtq_avx(auVar222,auVar227);
        auVar99 = vpackssdw_avx(auVar227,auVar98);
        auVar227 = vorps_avx(auVar295,auVar187);
        auVar218._0_8_ = auVar85._0_8_ ^ 0x8000000000000000;
        auVar218._8_4_ = auVar85._8_4_;
        auVar218._12_4_ = auVar85._12_4_ ^ 0x80000000;
        auVar227 = vpcmpgtq_avx(auVar218,auVar227);
        auVar227 = vpackssdw_avx(auVar227,auVar96);
        auVar227 = vblendvps_avx(auVar173._0_16_,auVar116,auVar183 ^ auVar227);
        auVar183 = vblendvps_avx(auVar173._16_16_,auVar137._16_16_,auVar183 ^ auVar99);
        auVar183 = vhaddps_avx(auVar183,auVar227);
        auVar183 = vhaddps_avx(auVar183,auVar183);
        auVar183 = vhaddps_avx(auVar183,auVar183);
      }
      auVar64._0_4_ = fVar284 + fVar290 + fVar95;
      auVar64._4_4_ = fVar287 + fVar291 + fVar139;
      auVar64._8_4_ = fVar288 + fVar292 + fVar140;
      auVar64._12_4_ = fVar289 + fVar293 + fVar141;
      auVar227 = vhaddps_avx(auVar64,auVar64);
      auVar227 = vhaddps_avx(auVar227,auVar227);
      fVar284 = auVar227._0_4_ + auVar183._0_4_;
      auVar183 = ZEXT416((uint)fVar284);
      auVar227 = auVar94._0_16_;
      fVar287 = fVar284;
      switch(uVar19) {
      case 1:
        auVar183 = vmaxss_avx(auVar183,ZEXT416(0));
        fVar287 = auVar183._0_4_;
        break;
      case 2:
        auVar183 = vcmpss_avx(ZEXT816(0) << 0x20,auVar183,1);
        auVar118._8_4_ = 0x3f800000;
        auVar118._0_8_ = 0x3f8000003f800000;
        auVar118._12_4_ = 0x3f800000;
        auVar183 = vblendvps_avx(ZEXT416((uint)*pfVar45),auVar118,auVar183);
        fVar287 = auVar183._0_4_;
LAB_002e6c85:
        fVar287 = fVar287 * fVar284;
        break;
      case 3:
        auVar183 = vmaxss_avx(auVar183,ZEXT416((uint)*pfVar45));
        fVar287 = auVar183._0_4_;
        if (pfVar45[1] < auVar183._0_4_) {
          fVar287 = pfVar45[1];
        }
        break;
      case 4:
        auVar183 = vminss_avx(auVar183,ZEXT416(0x42b0c0a5));
        auVar83._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
        auVar83._8_4_ = auVar183._8_4_ ^ 0x80000000;
        auVar83._12_4_ = auVar183._12_4_ ^ 0x80000000;
        auVar183 = vcmpss_avx(auVar183,ZEXT416(0xc2b0c0a5),1);
        auVar117._8_4_ = 0x42b0c0a5;
        auVar117._0_8_ = 0x42b0c0a542b0c0a5;
        auVar117._12_4_ = 0x42b0c0a5;
        auVar183 = vblendvps_avx(auVar83,auVar117,auVar183);
        fVar284 = expf(auVar183._0_4_);
        auVar183 = vpcmpeqd_avx(auVar227,auVar227);
        auVar94 = ZEXT1664(auVar183);
        auVar278 = ZEXT3264(_DAT_00555ee0);
        auVar225 = ZEXT3264(_DAT_00555ec0);
        fVar287 = 1.0 / (fVar284 + 1.0);
        break;
      case 5:
        fVar287 = expf(fVar284);
        fVar287 = logf(fVar287 + 1.0);
        fVar287 = tanhf(fVar287);
        auVar183 = vpcmpeqd_avx(auVar227,auVar227);
        auVar94 = ZEXT1664(auVar183);
        auVar278 = ZEXT3264(_DAT_00555ee0);
        auVar225 = ZEXT3264(_DAT_00555ec0);
        fVar287 = fVar287 * fVar284;
        break;
      case 6:
        fVar288 = *pfVar45;
        fVar289 = -pfVar45[1] / fVar288;
        fVar287 = 0.0;
        if ((fVar289 <= fVar284) && (fVar287 = fVar284, fVar284 <= fVar289 + 1.0 / fVar288)) {
          fVar287 = fVar288 * fVar284 + pfVar45[1];
          goto LAB_002e6c85;
        }
      }
      *(float *)((long)pvVar23 + uVar41 * 4) = fVar287;
      uVar41 = uVar41 + 1;
    } while (uVar41 != (long)(int)uVar40);
LAB_002e5977:
    iVar38 = 0;
  }
LAB_002e6cef:
  if ((int *)local_f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_f8._8_8_ == 0) {
      if (local_d8 == (Allocator *)0x0) {
        if ((void *)local_f8._0_8_ != (void *)0x0) {
          free((void *)local_f8._0_8_);
        }
      }
      else {
        (*local_d8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar38;
}

Assistant:

int InnerProduct_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}